

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

void embree::avx512::CurveNiIntersectorK<4,8>::
     intersect_t<embree::avx512::RibbonCurve1IntersectorK<embree::BezierCurveT,8,8>,embree::avx512::Intersect1KEpilogMU<8,8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  int iVar1;
  int iVar2;
  undefined1 (*pauVar3) [16];
  undefined1 (*pauVar4) [16];
  undefined1 (*pauVar5) [12];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  Primitive PVar8;
  uint uVar9;
  int iVar10;
  undefined4 uVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined8 uVar25;
  undefined8 uVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  int iVar61;
  int iVar62;
  int iVar63;
  int iVar64;
  int iVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  byte bVar79;
  byte bVar80;
  ulong uVar81;
  uint uVar82;
  uint uVar83;
  ulong uVar84;
  uint uVar85;
  Geometry *pGVar86;
  uint uVar87;
  long lVar88;
  ulong uVar89;
  byte bVar90;
  float fVar91;
  float fVar141;
  float fVar143;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar99 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  float fVar92;
  undefined1 auVar100 [16];
  float fVar142;
  float fVar144;
  float fVar146;
  float fVar147;
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  float fVar145;
  float fVar148;
  float fVar149;
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined4 uVar150;
  vint4 bi_2;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined8 uVar165;
  vint4 bi_1;
  undefined1 auVar166 [16];
  vint4 bi;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar174;
  float fVar186;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  float fVar187;
  float fVar196;
  float fVar197;
  vint4 ai_2;
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  float fVar198;
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  vint4 ai;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  vint4 ai_1;
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [32];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [64];
  undefined1 auVar226 [64];
  undefined1 in_ZMM20 [64];
  undefined1 in_ZMM21 [64];
  undefined1 auVar227 [64];
  undefined1 auVar228 [16];
  undefined1 auVar229 [64];
  undefined1 auVar230 [64];
  undefined1 auVar231 [64];
  undefined1 auVar232 [64];
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::CubicBezierCurve<embree::Vec3fx>,_8> bhit;
  RTCFilterFunctionNArguments local_6f0;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float fStack_6b4;
  Geometry *local_6b0;
  undefined1 (*local_6a8) [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined1 local_600 [32];
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  undefined8 local_5b0;
  undefined8 uStack_5a8;
  undefined4 local_5a0;
  undefined4 uStack_59c;
  undefined8 uStack_598;
  LinearSpace3fa *local_588;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  uint local_500;
  uint uStack_4fc;
  uint uStack_4f8;
  uint uStack_4f4;
  uint uStack_4f0;
  uint uStack_4ec;
  uint uStack_4e8;
  uint uStack_4e4;
  float local_4e0;
  undefined1 auStack_4dc [8];
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float fStack_4c4;
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  undefined4 local_460;
  int local_45c;
  undefined1 local_450 [16];
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  byte local_410;
  float local_400 [4];
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined1 local_310 [16];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  int local_2c0;
  int iStack_2bc;
  int iStack_2b8;
  int iStack_2b4;
  int iStack_2b0;
  int iStack_2ac;
  int iStack_2a8;
  int iStack_2a4;
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined4 local_240;
  undefined4 uStack_23c;
  undefined4 uStack_238;
  undefined4 uStack_234;
  undefined4 uStack_230;
  undefined4 uStack_22c;
  undefined4 uStack_228;
  undefined4 uStack_224;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined1 local_200 [32];
  uint local_1e0;
  uint uStack_1dc;
  uint uStack_1d8;
  uint uStack_1d4;
  uint uStack_1d0;
  uint uStack_1cc;
  uint uStack_1c8;
  uint uStack_1c4;
  uint local_1c0;
  uint uStack_1bc;
  uint uStack_1b8;
  uint uStack_1b4;
  uint uStack_1b0;
  uint uStack_1ac;
  uint uStack_1a8;
  uint uStack_1a4;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [8];
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  undefined4 uStack_104;
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar211 [64];
  
  PVar8 = prim[1];
  uVar84 = (ulong)(byte)PVar8;
  fVar187 = *(float *)(prim + uVar84 * 0x19 + 0x12);
  auVar96 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar96 = vinsertps_avx(auVar96,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar94 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar94 = vinsertps_avx(auVar94,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar96 = vsubps_avx(auVar96,*(undefined1 (*) [16])(prim + uVar84 * 0x19 + 6));
  auVar175._0_4_ = fVar187 * auVar96._0_4_;
  auVar175._4_4_ = fVar187 * auVar96._4_4_;
  auVar175._8_4_ = fVar187 * auVar96._8_4_;
  auVar175._12_4_ = fVar187 * auVar96._12_4_;
  auVar151._0_4_ = fVar187 * auVar94._0_4_;
  auVar151._4_4_ = fVar187 * auVar94._4_4_;
  auVar151._8_4_ = fVar187 * auVar94._8_4_;
  auVar151._12_4_ = fVar187 * auVar94._12_4_;
  auVar96 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 4 + 6)));
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar94 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 5 + 6)));
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar98 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 6 + 6)));
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar84 * 0xb + 6)));
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar20 = vcvtdq2ps_avx(auVar20);
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar8 * 0xc) + 6)));
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar8 * 0xc + uVar84 + 6)));
  auVar228 = vcvtdq2ps_avx(auVar228);
  uVar89 = (ulong)(uint)((int)(uVar84 * 9) * 2);
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + 6)));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar97 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar89 + uVar84 + 6)));
  auVar97 = vcvtdq2ps_avx(auVar97);
  uVar81 = (ulong)(uint)((int)(uVar84 * 5) << 2);
  auVar23 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar81 + 6)));
  auVar23 = vcvtdq2ps_avx(auVar23);
  auVar220._4_4_ = auVar151._0_4_;
  auVar220._0_4_ = auVar151._0_4_;
  auVar220._8_4_ = auVar151._0_4_;
  auVar220._12_4_ = auVar151._0_4_;
  auVar24 = vshufps_avx(auVar151,auVar151,0x55);
  auVar95 = vshufps_avx(auVar151,auVar151,0xaa);
  fVar187 = auVar95._0_4_;
  auVar167._0_4_ = fVar187 * auVar98._0_4_;
  fVar196 = auVar95._4_4_;
  auVar167._4_4_ = fVar196 * auVar98._4_4_;
  fVar197 = auVar95._8_4_;
  auVar167._8_4_ = fVar197 * auVar98._8_4_;
  fVar198 = auVar95._12_4_;
  auVar167._12_4_ = fVar198 * auVar98._12_4_;
  auVar100._0_4_ = auVar228._0_4_ * fVar187;
  auVar100._4_4_ = auVar228._4_4_ * fVar196;
  auVar100._8_4_ = auVar228._8_4_ * fVar197;
  auVar100._12_4_ = auVar228._12_4_ * fVar198;
  auVar152._0_4_ = auVar23._0_4_ * fVar187;
  auVar152._4_4_ = auVar23._4_4_ * fVar196;
  auVar152._8_4_ = auVar23._8_4_ * fVar197;
  auVar152._12_4_ = auVar23._12_4_ * fVar198;
  auVar95 = vfmadd231ps_fma(auVar167,auVar24,auVar94);
  auVar99 = vfmadd231ps_fma(auVar100,auVar24,auVar21);
  auVar24 = vfmadd231ps_fma(auVar152,auVar97,auVar24);
  auVar93 = vfmadd231ps_fma(auVar95,auVar220,auVar96);
  auVar99 = vfmadd231ps_fma(auVar99,auVar220,auVar20);
  auVar151 = vfmadd231ps_fma(auVar24,auVar22,auVar220);
  auVar221._4_4_ = auVar175._0_4_;
  auVar221._0_4_ = auVar175._0_4_;
  auVar221._8_4_ = auVar175._0_4_;
  auVar221._12_4_ = auVar175._0_4_;
  auVar24 = vshufps_avx(auVar175,auVar175,0x55);
  auVar95 = vshufps_avx(auVar175,auVar175,0xaa);
  fVar187 = auVar95._0_4_;
  auVar222._0_4_ = fVar187 * auVar98._0_4_;
  fVar196 = auVar95._4_4_;
  auVar222._4_4_ = fVar196 * auVar98._4_4_;
  fVar197 = auVar95._8_4_;
  auVar222._8_4_ = fVar197 * auVar98._8_4_;
  fVar198 = auVar95._12_4_;
  auVar222._12_4_ = fVar198 * auVar98._12_4_;
  auVar188._0_4_ = auVar228._0_4_ * fVar187;
  auVar188._4_4_ = auVar228._4_4_ * fVar196;
  auVar188._8_4_ = auVar228._8_4_ * fVar197;
  auVar188._12_4_ = auVar228._12_4_ * fVar198;
  auVar176._0_4_ = auVar23._0_4_ * fVar187;
  auVar176._4_4_ = auVar23._4_4_ * fVar196;
  auVar176._8_4_ = auVar23._8_4_ * fVar197;
  auVar176._12_4_ = auVar23._12_4_ * fVar198;
  auVar94 = vfmadd231ps_fma(auVar222,auVar24,auVar94);
  auVar98 = vfmadd231ps_fma(auVar188,auVar24,auVar21);
  auVar21 = vfmadd231ps_fma(auVar176,auVar24,auVar97);
  auVar228 = vfmadd231ps_fma(auVar94,auVar221,auVar96);
  auVar97 = vfmadd231ps_fma(auVar98,auVar221,auVar20);
  auVar212._8_4_ = 0x7fffffff;
  auVar212._0_8_ = 0x7fffffff7fffffff;
  auVar212._12_4_ = 0x7fffffff;
  auVar23 = vfmadd231ps_fma(auVar21,auVar221,auVar22);
  auVar96 = vandps_avx(auVar93,auVar212);
  auVar208._8_4_ = 0x219392ef;
  auVar208._0_8_ = 0x219392ef219392ef;
  auVar208._12_4_ = 0x219392ef;
  uVar89 = vcmpps_avx512vl(auVar96,auVar208,1);
  bVar13 = (bool)((byte)uVar89 & 1);
  auVar95._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._0_4_;
  bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar95._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._4_4_;
  bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar95._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._8_4_;
  bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar95._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar93._12_4_;
  auVar96 = vandps_avx(auVar99,auVar212);
  uVar89 = vcmpps_avx512vl(auVar96,auVar208,1);
  bVar13 = (bool)((byte)uVar89 & 1);
  auVar93._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar99._0_4_;
  bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar93._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar99._4_4_;
  bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar93._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar99._8_4_;
  bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar93._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar99._12_4_;
  auVar96 = vandps_avx(auVar151,auVar212);
  uVar89 = vcmpps_avx512vl(auVar96,auVar208,1);
  bVar13 = (bool)((byte)uVar89 & 1);
  auVar99._0_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar151._0_4_;
  bVar13 = (bool)((byte)(uVar89 >> 1) & 1);
  auVar99._4_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar151._4_4_;
  bVar13 = (bool)((byte)(uVar89 >> 2) & 1);
  auVar99._8_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar151._8_4_;
  bVar13 = (bool)((byte)(uVar89 >> 3) & 1);
  auVar99._12_4_ = (uint)bVar13 * 0x219392ef | (uint)!bVar13 * auVar151._12_4_;
  auVar94 = vrcp14ps_avx512vl(auVar95);
  auVar209._8_4_ = 0x3f800000;
  auVar209._0_8_ = &DAT_3f8000003f800000;
  auVar209._12_4_ = 0x3f800000;
  auVar96 = vfnmadd213ps_fma(auVar95,auVar94,auVar209);
  auVar20 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar93);
  auVar96 = vfnmadd213ps_fma(auVar93,auVar94,auVar209);
  auVar21 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
  auVar94 = vrcp14ps_avx512vl(auVar99);
  auVar96 = vfnmadd213ps_fma(auVar99,auVar94,auVar209);
  auVar22 = vfmadd132ps_fma(auVar96,auVar94,auVar94);
  auVar96._8_8_ = 0;
  auVar96._0_8_ = *(ulong *)(prim + uVar84 * 7 + 6);
  auVar96 = vpmovsxwd_avx(auVar96);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar228);
  auVar199._0_4_ = auVar20._0_4_ * auVar96._0_4_;
  auVar199._4_4_ = auVar20._4_4_ * auVar96._4_4_;
  auVar199._8_4_ = auVar20._8_4_ * auVar96._8_4_;
  auVar199._12_4_ = auVar20._12_4_ * auVar96._12_4_;
  auVar94._8_8_ = 0;
  auVar94._0_8_ = *(ulong *)(prim + uVar84 * 9 + 6);
  auVar96 = vpmovsxwd_avx(auVar94);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar228);
  auVar95 = vpbroadcastd_avx512vl();
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + 6);
  auVar94 = vpmovsxwd_avx(auVar98);
  auVar168._0_4_ = auVar20._0_4_ * auVar96._0_4_;
  auVar168._4_4_ = auVar20._4_4_ * auVar96._4_4_;
  auVar168._8_4_ = auVar20._8_4_ * auVar96._8_4_;
  auVar168._12_4_ = auVar20._12_4_ * auVar96._12_4_;
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar8 * 0x10 + uVar84 * -2 + 6);
  auVar96 = vpmovsxwd_avx(auVar20);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar97);
  auVar210._0_4_ = auVar21._0_4_ * auVar96._0_4_;
  auVar210._4_4_ = auVar21._4_4_ * auVar96._4_4_;
  auVar210._8_4_ = auVar21._8_4_ * auVar96._8_4_;
  auVar210._12_4_ = auVar21._12_4_ * auVar96._12_4_;
  auVar211 = ZEXT1664(auVar210);
  auVar96 = vcvtdq2ps_avx(auVar94);
  auVar96 = vsubps_avx(auVar96,auVar97);
  auVar166._0_4_ = auVar21._0_4_ * auVar96._0_4_;
  auVar166._4_4_ = auVar21._4_4_ * auVar96._4_4_;
  auVar166._8_4_ = auVar21._8_4_ * auVar96._8_4_;
  auVar166._12_4_ = auVar21._12_4_ * auVar96._12_4_;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar81 + uVar84 + 6);
  auVar96 = vpmovsxwd_avx(auVar21);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar23);
  auVar189._0_4_ = auVar22._0_4_ * auVar96._0_4_;
  auVar189._4_4_ = auVar22._4_4_ * auVar96._4_4_;
  auVar189._8_4_ = auVar22._8_4_ * auVar96._8_4_;
  auVar189._12_4_ = auVar22._12_4_ * auVar96._12_4_;
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar84 * 0x17 + 6);
  auVar96 = vpmovsxwd_avx(auVar228);
  auVar96 = vcvtdq2ps_avx(auVar96);
  auVar96 = vsubps_avx(auVar96,auVar23);
  auVar153._0_4_ = auVar22._0_4_ * auVar96._0_4_;
  auVar153._4_4_ = auVar22._4_4_ * auVar96._4_4_;
  auVar153._8_4_ = auVar22._8_4_ * auVar96._8_4_;
  auVar153._12_4_ = auVar22._12_4_ * auVar96._12_4_;
  auVar96 = vpminsd_avx(auVar199,auVar168);
  auVar94 = vpminsd_avx(auVar210,auVar166);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar94 = vpminsd_avx(auVar189,auVar153);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar22._4_4_ = uVar150;
  auVar22._0_4_ = uVar150;
  auVar22._8_4_ = uVar150;
  auVar22._12_4_ = uVar150;
  auVar94 = vmaxps_avx512vl(auVar94,auVar22);
  auVar96 = vmaxps_avx(auVar96,auVar94);
  auVar97._8_4_ = 0x3f7ffffa;
  auVar97._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar97._12_4_ = 0x3f7ffffa;
  local_310 = vmulps_avx512vl(auVar96,auVar97);
  auVar185 = ZEXT1664(local_310);
  auVar96 = vpmaxsd_avx(auVar199,auVar168);
  auVar94 = vpmaxsd_avx(auVar210,auVar166);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar94 = vpmaxsd_avx(auVar189,auVar153);
  uVar150 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar23._4_4_ = uVar150;
  auVar23._0_4_ = uVar150;
  auVar23._8_4_ = uVar150;
  auVar23._12_4_ = uVar150;
  auVar94 = vminps_avx512vl(auVar94,auVar23);
  auVar96 = vminps_avx(auVar96,auVar94);
  auVar24._8_4_ = 0x3f800003;
  auVar24._0_8_ = 0x3f8000033f800003;
  auVar24._12_4_ = 0x3f800003;
  auVar96 = vmulps_avx512vl(auVar96,auVar24);
  uVar25 = vcmpps_avx512vl(local_310,auVar96,2);
  uVar89 = vpcmpgtd_avx512vl(auVar95,_DAT_01ff0cf0);
  uVar89 = ((byte)uVar25 & 0xf) & uVar89;
  if ((char)uVar89 != '\0') {
    local_588 = pre->ray_space + k;
    local_6a8 = (undefined1 (*) [32])&local_1e0;
    local_300 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
    do {
      auVar183 = auVar211._0_32_;
      auVar126 = auVar185._0_32_;
      local_620 = in_ZMM21._0_32_;
      local_600 = in_ZMM20._0_32_;
      lVar27 = 0;
      for (uVar81 = uVar89; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        lVar27 = lVar27 + 1;
      }
      uVar87 = *(uint *)(prim + 2);
      uVar9 = *(uint *)(prim + lVar27 * 4 + 6);
      pGVar86 = (context->scene->geometries).items[uVar87].ptr;
      uVar81 = (ulong)*(uint *)(*(long *)&pGVar86->field_0x58 +
                               pGVar86[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i * (ulong)uVar9);
      p_Var12 = pGVar86[1].intersectionFilterN;
      lVar27 = *(long *)&pGVar86[1].time_range.upper;
      auVar96 = *(undefined1 (*) [16])(lVar27 + (long)p_Var12 * uVar81);
      pauVar3 = (undefined1 (*) [16])(lVar27 + (uVar81 + 1) * (long)p_Var12);
      uVar25 = *(undefined8 *)*pauVar3;
      uVar66 = *(undefined8 *)(*pauVar3 + 8);
      auVar21 = *pauVar3;
      auVar94 = *pauVar3;
      pauVar4 = (undefined1 (*) [16])(lVar27 + (uVar81 + 2) * (long)p_Var12);
      uVar67 = *(undefined8 *)*pauVar4;
      uVar68 = *(undefined8 *)(*pauVar4 + 8);
      auVar20 = *pauVar4;
      auVar98 = *pauVar4;
      uVar89 = uVar89 - 1 & uVar89;
      pauVar5 = (undefined1 (*) [12])(lVar27 + (uVar81 + 3) * (long)p_Var12);
      local_420 = *(undefined8 *)*pauVar5;
      uStack_418 = *(undefined8 *)(*pauVar5 + 8);
      local_6c0 = (float)local_420;
      fStack_6bc = (float)((ulong)local_420 >> 0x20);
      fStack_6b8 = (float)uStack_418;
      fStack_6b4 = (float)((ulong)uStack_418 >> 0x20);
      if (uVar89 != 0) {
        uVar84 = uVar89 - 1 & uVar89;
        for (uVar81 = uVar89; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
        }
        if (uVar84 != 0) {
          for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x8000000000000000) {
          }
        }
      }
      iVar10 = (int)pGVar86[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      auVar228 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),
                               ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c);
      auVar228 = vinsertps_avx(auVar228,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
      auVar97 = vsubps_avx(auVar96,auVar228);
      uVar150 = auVar97._0_4_;
      auVar169._4_4_ = uVar150;
      auVar169._0_4_ = uVar150;
      auVar169._8_4_ = uVar150;
      auVar169._12_4_ = uVar150;
      auVar22 = vshufps_avx(auVar97,auVar97,0x55);
      auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
      aVar6 = (local_588->vx).field_0;
      aVar7 = (local_588->vy).field_0;
      fVar187 = (local_588->vz).field_0.m128[0];
      fVar196 = *(float *)((long)&(local_588->vz).field_0 + 4);
      fVar197 = *(float *)((long)&(local_588->vz).field_0 + 8);
      fVar198 = *(float *)((long)&(local_588->vz).field_0 + 0xc);
      auVar215._0_4_ = fVar187 * auVar97._0_4_;
      auVar215._4_4_ = fVar196 * auVar97._4_4_;
      auVar215._8_4_ = fVar197 * auVar97._8_4_;
      auVar215._12_4_ = fVar198 * auVar97._12_4_;
      auVar22 = vfmadd231ps_fma(auVar215,(undefined1  [16])aVar7,auVar22);
      auVar24 = vfmadd231ps_fma(auVar22,(undefined1  [16])aVar6,auVar169);
      auVar22 = vshufps_avx(auVar96,auVar96,0xff);
      auVar23 = vsubps_avx(auVar94,auVar228);
      uVar150 = auVar23._0_4_;
      auVar177._4_4_ = uVar150;
      auVar177._0_4_ = uVar150;
      auVar177._8_4_ = uVar150;
      auVar177._12_4_ = uVar150;
      auVar97 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar216._0_4_ = fVar187 * auVar23._0_4_;
      auVar216._4_4_ = fVar196 * auVar23._4_4_;
      auVar216._8_4_ = fVar197 * auVar23._8_4_;
      auVar216._12_4_ = fVar198 * auVar23._12_4_;
      auVar97 = vfmadd231ps_fma(auVar216,(undefined1  [16])aVar7,auVar97);
      auVar95 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar6,auVar177);
      auVar94 = vshufps_avx(auVar94,auVar94,0xff);
      auVar23 = vsubps_avx(auVar98,auVar228);
      uVar150 = auVar23._0_4_;
      auVar213._4_4_ = uVar150;
      auVar213._0_4_ = uVar150;
      auVar213._8_4_ = uVar150;
      auVar213._12_4_ = uVar150;
      auVar97 = vshufps_avx(auVar23,auVar23,0x55);
      auVar23 = vshufps_avx(auVar23,auVar23,0xaa);
      auVar218._0_4_ = fVar187 * auVar23._0_4_;
      auVar218._4_4_ = fVar196 * auVar23._4_4_;
      auVar218._8_4_ = fVar197 * auVar23._8_4_;
      auVar218._12_4_ = fVar198 * auVar23._12_4_;
      auVar97 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar7,auVar97);
      auVar23 = vfmadd231ps_fma(auVar97,(undefined1  [16])aVar6,auVar213);
      auVar98 = vshufps_avx(auVar98,auVar98,0xff);
      auVar69._12_4_ = fStack_6b4;
      auVar69._0_12_ = *pauVar5;
      auVar97 = vsubps_avx512vl(auVar69,auVar228);
      uVar150 = auVar97._0_4_;
      auVar178._4_4_ = uVar150;
      auVar178._0_4_ = uVar150;
      auVar178._8_4_ = uVar150;
      auVar178._12_4_ = uVar150;
      auVar228 = vshufps_avx(auVar97,auVar97,0x55);
      auVar97 = vshufps_avx(auVar97,auVar97,0xaa);
      auVar219._0_4_ = fVar187 * auVar97._0_4_;
      auVar219._4_4_ = fVar196 * auVar97._4_4_;
      auVar219._8_4_ = fVar197 * auVar97._8_4_;
      auVar219._12_4_ = fVar198 * auVar97._12_4_;
      auVar228 = vfmadd231ps_fma(auVar219,(undefined1  [16])aVar7,auVar228);
      auVar228 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar6,auVar178);
      lVar27 = (long)iVar10 * 0x44;
      auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar27);
      auVar97 = vshufps_avx512vl(auVar69,auVar69,0xff);
      local_560 = vbroadcastss_avx512vl(auVar24);
      auVar101._8_4_ = 1;
      auVar101._0_8_ = 0x100000001;
      auVar101._12_4_ = 1;
      auVar101._16_4_ = 1;
      auVar101._20_4_ = 1;
      auVar101._24_4_ = 1;
      auVar101._28_4_ = 1;
      local_680 = vpermps_avx512vl(auVar101,ZEXT1632(auVar24));
      uVar165 = auVar22._0_8_;
      local_80._8_8_ = uVar165;
      local_80._0_8_ = uVar165;
      local_80._16_8_ = uVar165;
      local_80._24_8_ = uVar165;
      auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x484);
      uVar150 = auVar95._0_4_;
      local_6a0._4_4_ = uVar150;
      local_6a0._0_4_ = uVar150;
      local_6a0._8_4_ = uVar150;
      local_6a0._12_4_ = uVar150;
      local_6a0._16_4_ = uVar150;
      local_6a0._20_4_ = uVar150;
      local_6a0._24_4_ = uVar150;
      local_6a0._28_4_ = uVar150;
      local_2e0 = vpermps_avx512vl(auVar101,ZEXT1632(auVar95));
      uVar165 = auVar94._0_8_;
      local_a0._8_8_ = uVar165;
      local_a0._0_8_ = uVar165;
      local_a0._16_8_ = uVar165;
      local_a0._24_8_ = uVar165;
      auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x908);
      local_c0 = vbroadcastss_avx512vl(auVar23);
      local_e0 = vpermps_avx512vl(auVar101,ZEXT1632(auVar23));
      local_100 = vbroadcastsd_avx512vl(auVar98);
      auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0xd8c);
      local_640 = vbroadcastss_avx512vl(auVar228);
      auVar230 = ZEXT3264(local_640);
      local_660 = vpermps_avx512vl(auVar101,ZEXT1632(auVar228));
      auVar231 = ZEXT3264(local_660);
      _local_120 = vbroadcastsd_avx512vl(auVar97);
      auVar101 = vmulps_avx512vl(local_640,auVar115);
      auVar102 = vmulps_avx512vl(local_660,auVar115);
      auVar101 = vfmadd231ps_avx512vl(auVar101,auVar116,local_c0);
      auVar102 = vfmadd231ps_avx512vl(auVar102,auVar116,local_e0);
      auVar94 = vfmadd231ps_fma(auVar101,auVar118,local_6a0);
      auVar103 = vfmadd231ps_avx512vl(auVar102,auVar118,local_2e0);
      auVar104 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar117,local_560);
      auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar27);
      auVar102 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x484);
      auVar105 = vfmadd231ps_avx512vl(auVar103,auVar117,local_680);
      auVar103 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x908);
      auVar114 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0xd8c);
      auVar106 = vmulps_avx512vl(local_640,auVar114);
      auVar107 = vmulps_avx512vl(local_660,auVar114);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar103,local_c0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar103,local_e0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar102,local_6a0);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar102,local_2e0);
      auVar106 = vfmadd231ps_avx512vl(auVar106,auVar101,local_560);
      auVar107 = vfmadd231ps_avx512vl(auVar107,auVar101,local_680);
      auVar108 = vsubps_avx512vl(auVar106,auVar104);
      auVar109 = vsubps_avx512vl(auVar107,auVar105);
      auVar110 = vmulps_avx512vl(auVar105,auVar108);
      auVar111 = vmulps_avx512vl(auVar104,auVar109);
      auVar110 = vsubps_avx512vl(auVar110,auVar111);
      auVar111 = vmulps_avx512vl(_local_120,auVar115);
      auVar111 = vfmadd231ps_avx512vl(auVar111,auVar116,local_100);
      auVar94 = vfmadd231ps_fma(auVar111,auVar118,local_a0);
      auVar111 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),auVar117,local_80);
      auVar112 = vmulps_avx512vl(_local_120,auVar114);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar103,local_100);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar102,local_a0);
      auVar22 = vfmadd231ps_fma(auVar112,auVar101,local_80);
      auVar112 = vmulps_avx512vl(auVar109,auVar109);
      auVar112 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
      auVar113 = vmaxps_avx512vl(auVar111,ZEXT1632(auVar22));
      auVar113 = vmulps_avx512vl(auVar113,auVar113);
      auVar112 = vmulps_avx512vl(auVar113,auVar112);
      auVar110 = vmulps_avx512vl(auVar110,auVar110);
      uVar165 = vcmpps_avx512vl(auVar110,auVar112,2);
      auVar94 = vblendps_avx(auVar24,auVar96,8);
      auVar97 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar98 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vblendps_avx(auVar95,*pauVar3,8);
      auVar94 = vandps_avx512vl(auVar94,auVar97);
      auVar98 = vmaxps_avx(auVar98,auVar94);
      auVar94 = vblendps_avx(auVar23,*pauVar4,8);
      auVar99 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vblendps_avx(auVar228,auVar69,8);
      auVar94 = vandps_avx512vl(auVar94,auVar97);
      auVar94 = vmaxps_avx(auVar99,auVar94);
      auVar94 = vmaxps_avx(auVar98,auVar94);
      auVar98 = vmovshdup_avx(auVar94);
      auVar98 = vmaxss_avx(auVar98,auVar94);
      auVar94 = vshufpd_avx(auVar94,auVar94,1);
      auVar94 = vmaxss_avx(auVar94,auVar98);
      auVar112._0_4_ = (float)iVar10;
      _auStack_4dc = auVar24._4_12_;
      auVar112._4_4_ = auVar112._0_4_;
      auVar112._8_4_ = auVar112._0_4_;
      auVar112._12_4_ = auVar112._0_4_;
      auVar112._16_4_ = auVar112._0_4_;
      auVar112._20_4_ = auVar112._0_4_;
      auVar112._24_4_ = auVar112._0_4_;
      auVar112._28_4_ = auVar112._0_4_;
      uVar26 = vcmpps_avx512vl(auVar112,_DAT_02020f40,0xe);
      bVar90 = (byte)uVar165 & (byte)uVar26;
      auVar94 = vmulss_avx512f(auVar94,ZEXT416(0x35000000));
      auVar110._8_4_ = 2;
      auVar110._0_8_ = 0x200000002;
      auVar110._12_4_ = 2;
      auVar110._16_4_ = 2;
      auVar110._20_4_ = 2;
      auVar110._24_4_ = 2;
      auVar110._28_4_ = 2;
      local_140 = vpermps_avx512vl(auVar110,ZEXT1632(auVar24));
      local_160 = vpermps_avx512vl(auVar110,ZEXT1632(auVar95));
      local_180 = vpermps_avx512vl(auVar110,ZEXT1632(auVar23));
      local_1a0 = vpermps_avx2(auVar110,ZEXT1632(auVar228));
      uVar85 = *(uint *)(ray + k * 4 + 0x60);
      auVar98 = local_c0._0_16_;
      local_4e0 = auVar112._0_4_;
      if (bVar90 == 0) {
        auVar98 = vxorps_avx512vl(auVar98,auVar98);
        auVar229 = ZEXT1664(auVar98);
        auVar211 = ZEXT3264(auVar183);
        in_ZMM20 = ZEXT3264(local_600);
        auVar185 = ZEXT3264(auVar126);
        in_ZMM21 = ZEXT3264(local_620);
        auVar227 = ZEXT3264(local_560);
        auVar226 = ZEXT3264(local_680);
        auVar225 = ZEXT3264(local_6a0);
      }
      else {
        local_580._0_16_ = ZEXT416(uVar85);
        local_540._0_16_ = auVar94;
        auVar114 = vmulps_avx512vl(local_1a0,auVar114);
        auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar114);
        auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar103);
        auVar114 = vfmadd213ps_avx512vl(auVar101,local_140,auVar102);
        auVar115 = vmulps_avx512vl(local_1a0,auVar115);
        auVar116 = vfmadd213ps_avx512vl(auVar116,local_180,auVar115);
        auVar102 = vfmadd213ps_avx512vl(auVar118,local_160,auVar116);
        auVar118 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1210);
        auVar116 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1694);
        auVar115 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1b18);
        auVar101 = *(undefined1 (*) [32])(bezier_basis0 + lVar27 + 0x1f9c);
        auVar110 = vfmadd213ps_avx512vl(auVar117,local_140,auVar102);
        auVar117 = vmulps_avx512vl(local_640,auVar101);
        auVar102 = vmulps_avx512vl(local_660,auVar101);
        auVar101 = vmulps_avx512vl(local_1a0,auVar101);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,local_c0);
        auVar102 = vfmadd231ps_avx512vl(auVar102,auVar115,local_e0);
        auVar115 = vfmadd231ps_avx512vl(auVar101,local_180,auVar115);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar116,local_6a0);
        auVar101 = vfmadd231ps_avx512vl(auVar102,auVar116,local_2e0);
        auVar102 = vfmadd231ps_avx512vl(auVar115,local_160,auVar116);
        auVar103 = vfmadd231ps_avx512vl(auVar117,auVar118,local_560);
        auVar226 = ZEXT3264(local_680);
        auVar101 = vfmadd231ps_avx512vl(auVar101,auVar118,local_680);
        auVar117 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1210);
        auVar116 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1b18);
        auVar115 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1f9c);
        auVar102 = vfmadd231ps_avx512vl(auVar102,local_140,auVar118);
        auVar118 = vmulps_avx512vl(local_640,auVar115);
        auVar113 = vmulps_avx512vl(local_660,auVar115);
        auVar115 = vmulps_avx512vl(local_1a0,auVar115);
        auVar232 = ZEXT1664(auVar94);
        auVar119 = vfmadd231ps_avx512vl(auVar118,auVar116,local_c0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar116,local_e0);
        auVar116 = vfmadd231ps_avx512vl(auVar115,local_180,auVar116);
        auVar118 = *(undefined1 (*) [32])(bezier_basis1 + lVar27 + 0x1694);
        auVar115 = vfmadd231ps_avx512vl(auVar119,auVar118,local_6a0);
        auVar113 = vfmadd231ps_avx512vl(auVar113,auVar118,local_2e0);
        auVar118 = vfmadd231ps_avx512vl(auVar116,local_160,auVar118);
        auVar116 = vfmadd231ps_avx512vl(auVar115,auVar117,local_560);
        auVar115 = vfmadd231ps_avx512vl(auVar113,auVar117,local_680);
        auVar113 = vfmadd231ps_avx512vl(auVar118,local_140,auVar117);
        auVar223._8_4_ = 0x7fffffff;
        auVar223._0_8_ = 0x7fffffff7fffffff;
        auVar223._12_4_ = 0x7fffffff;
        auVar223._16_4_ = 0x7fffffff;
        auVar223._20_4_ = 0x7fffffff;
        auVar223._24_4_ = 0x7fffffff;
        auVar223._28_4_ = 0x7fffffff;
        auVar117 = vandps_avx(auVar103,auVar223);
        auVar118 = vandps_avx(auVar101,auVar223);
        auVar118 = vmaxps_avx(auVar117,auVar118);
        auVar117 = vandps_avx(auVar102,auVar223);
        auVar117 = vmaxps_avx(auVar118,auVar117);
        auVar102 = vbroadcastss_avx512vl(auVar94);
        uVar81 = vcmpps_avx512vl(auVar117,auVar102,1);
        bVar13 = (bool)((byte)uVar81 & 1);
        auVar119._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar103._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar119._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar103._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar119._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar103._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar119._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar103._12_4_);
        bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar119._16_4_ = (float)((uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar103._16_4_);
        bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar119._20_4_ = (float)((uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar103._20_4_);
        bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar119._24_4_ = (float)((uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar103._24_4_);
        bVar13 = SUB81(uVar81 >> 7,0);
        auVar119._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * auVar103._28_4_;
        bVar13 = (bool)((byte)uVar81 & 1);
        auVar120._0_4_ = (float)((uint)bVar13 * auVar109._0_4_ | (uint)!bVar13 * auVar101._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar120._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar101._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar120._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar101._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar120._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar101._12_4_);
        bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar120._16_4_ = (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * auVar101._16_4_);
        bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar120._20_4_ = (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * auVar101._20_4_);
        bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar120._24_4_ = (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * auVar101._24_4_);
        bVar13 = SUB81(uVar81 >> 7,0);
        auVar120._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar101._28_4_;
        auVar117 = vandps_avx(auVar223,auVar116);
        auVar118 = vandps_avx(auVar115,auVar223);
        auVar118 = vmaxps_avx(auVar117,auVar118);
        auVar117 = vandps_avx(auVar113,auVar223);
        auVar117 = vmaxps_avx(auVar118,auVar117);
        uVar81 = vcmpps_avx512vl(auVar117,auVar102,1);
        bVar13 = (bool)((byte)uVar81 & 1);
        auVar113._0_4_ = (float)((uint)bVar13 * auVar108._0_4_ | (uint)!bVar13 * auVar116._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar113._4_4_ = (float)((uint)bVar13 * auVar108._4_4_ | (uint)!bVar13 * auVar116._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar113._8_4_ = (float)((uint)bVar13 * auVar108._8_4_ | (uint)!bVar13 * auVar116._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar113._12_4_ = (float)((uint)bVar13 * auVar108._12_4_ | (uint)!bVar13 * auVar116._12_4_);
        bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar113._16_4_ = (float)((uint)bVar13 * auVar108._16_4_ | (uint)!bVar13 * auVar116._16_4_);
        bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar113._20_4_ = (float)((uint)bVar13 * auVar108._20_4_ | (uint)!bVar13 * auVar116._20_4_);
        bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar113._24_4_ = (float)((uint)bVar13 * auVar108._24_4_ | (uint)!bVar13 * auVar116._24_4_);
        bVar13 = SUB81(uVar81 >> 7,0);
        auVar113._28_4_ = (uint)bVar13 * auVar108._28_4_ | (uint)!bVar13 * auVar116._28_4_;
        bVar13 = (bool)((byte)uVar81 & 1);
        auVar108._0_4_ = (float)((uint)bVar13 * auVar109._0_4_ | (uint)!bVar13 * auVar115._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar108._4_4_ = (float)((uint)bVar13 * auVar109._4_4_ | (uint)!bVar13 * auVar115._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar108._8_4_ = (float)((uint)bVar13 * auVar109._8_4_ | (uint)!bVar13 * auVar115._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar108._12_4_ = (float)((uint)bVar13 * auVar109._12_4_ | (uint)!bVar13 * auVar115._12_4_);
        bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar108._16_4_ = (float)((uint)bVar13 * auVar109._16_4_ | (uint)!bVar13 * auVar115._16_4_);
        bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar108._20_4_ = (float)((uint)bVar13 * auVar109._20_4_ | (uint)!bVar13 * auVar115._20_4_);
        bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar108._24_4_ = (float)((uint)bVar13 * auVar109._24_4_ | (uint)!bVar13 * auVar115._24_4_);
        bVar13 = SUB81(uVar81 >> 7,0);
        auVar108._28_4_ = (uint)bVar13 * auVar109._28_4_ | (uint)!bVar13 * auVar115._28_4_;
        auVar100 = vxorps_avx512vl(auVar98,auVar98);
        auVar229 = ZEXT1664(auVar100);
        auVar117 = vfmadd213ps_avx512vl(auVar119,auVar119,ZEXT1632(auVar100));
        auVar98 = vfmadd231ps_fma(auVar117,auVar120,auVar120);
        auVar116 = vrsqrt14ps_avx512vl(ZEXT1632(auVar98));
        fVar187 = auVar116._0_4_;
        fVar196 = auVar116._4_4_;
        fVar197 = auVar116._8_4_;
        fVar198 = auVar116._12_4_;
        fVar174 = auVar116._16_4_;
        fVar186 = auVar116._20_4_;
        fVar91 = auVar116._24_4_;
        auVar117._4_4_ = fVar196 * fVar196 * fVar196 * auVar98._4_4_ * -0.5;
        auVar117._0_4_ = fVar187 * fVar187 * fVar187 * auVar98._0_4_ * -0.5;
        auVar117._8_4_ = fVar197 * fVar197 * fVar197 * auVar98._8_4_ * -0.5;
        auVar117._12_4_ = fVar198 * fVar198 * fVar198 * auVar98._12_4_ * -0.5;
        auVar117._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar117._20_4_ = fVar186 * fVar186 * fVar186 * -0.0;
        auVar117._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar117._28_4_ = 0;
        auVar101 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar101,auVar116);
        auVar118._4_4_ = auVar120._4_4_ * auVar117._4_4_;
        auVar118._0_4_ = auVar120._0_4_ * auVar117._0_4_;
        auVar118._8_4_ = auVar120._8_4_ * auVar117._8_4_;
        auVar118._12_4_ = auVar120._12_4_ * auVar117._12_4_;
        auVar118._16_4_ = auVar120._16_4_ * auVar117._16_4_;
        auVar118._20_4_ = auVar120._20_4_ * auVar117._20_4_;
        auVar118._24_4_ = auVar120._24_4_ * auVar117._24_4_;
        auVar118._28_4_ = auVar116._28_4_;
        auVar116._4_4_ = auVar117._4_4_ * -auVar119._4_4_;
        auVar116._0_4_ = auVar117._0_4_ * -auVar119._0_4_;
        auVar116._8_4_ = auVar117._8_4_ * -auVar119._8_4_;
        auVar116._12_4_ = auVar117._12_4_ * -auVar119._12_4_;
        auVar116._16_4_ = auVar117._16_4_ * -auVar119._16_4_;
        auVar116._20_4_ = auVar117._20_4_ * -auVar119._20_4_;
        auVar116._24_4_ = auVar117._24_4_ * -auVar119._24_4_;
        auVar116._28_4_ = auVar119._28_4_ ^ 0x80000000;
        auVar109 = vmulps_avx512vl(auVar117,ZEXT1632(auVar100));
        auVar119 = ZEXT1632(auVar100);
        auVar115 = vfmadd213ps_avx512vl(auVar113,auVar113,auVar119);
        auVar98 = vfmadd231ps_fma(auVar115,auVar108,auVar108);
        auVar103 = vrsqrt14ps_avx512vl(ZEXT1632(auVar98));
        fVar187 = auVar103._0_4_;
        fVar196 = auVar103._4_4_;
        fVar197 = auVar103._8_4_;
        fVar198 = auVar103._12_4_;
        fVar174 = auVar103._16_4_;
        fVar186 = auVar103._20_4_;
        fVar91 = auVar103._24_4_;
        auVar115._4_4_ = fVar196 * fVar196 * fVar196 * auVar98._4_4_ * -0.5;
        auVar115._0_4_ = fVar187 * fVar187 * fVar187 * auVar98._0_4_ * -0.5;
        auVar115._8_4_ = fVar197 * fVar197 * fVar197 * auVar98._8_4_ * -0.5;
        auVar115._12_4_ = fVar198 * fVar198 * fVar198 * auVar98._12_4_ * -0.5;
        auVar115._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
        auVar115._20_4_ = fVar186 * fVar186 * fVar186 * -0.0;
        auVar115._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
        auVar115._28_4_ = 0;
        auVar115 = vfmadd231ps_avx512vl(auVar115,auVar101,auVar103);
        auVar102._4_4_ = auVar108._4_4_ * auVar115._4_4_;
        auVar102._0_4_ = auVar108._0_4_ * auVar115._0_4_;
        auVar102._8_4_ = auVar108._8_4_ * auVar115._8_4_;
        auVar102._12_4_ = auVar108._12_4_ * auVar115._12_4_;
        auVar102._16_4_ = auVar108._16_4_ * auVar115._16_4_;
        auVar102._20_4_ = auVar108._20_4_ * auVar115._20_4_;
        auVar102._24_4_ = auVar108._24_4_ * auVar115._24_4_;
        auVar102._28_4_ = auVar103._28_4_;
        auVar103._4_4_ = -auVar113._4_4_ * auVar115._4_4_;
        auVar103._0_4_ = -auVar113._0_4_ * auVar115._0_4_;
        auVar103._8_4_ = -auVar113._8_4_ * auVar115._8_4_;
        auVar103._12_4_ = -auVar113._12_4_ * auVar115._12_4_;
        auVar103._16_4_ = -auVar113._16_4_ * auVar115._16_4_;
        auVar103._20_4_ = -auVar113._20_4_ * auVar115._20_4_;
        auVar103._24_4_ = -auVar113._24_4_ * auVar115._24_4_;
        auVar103._28_4_ = auVar117._28_4_;
        auVar117 = vmulps_avx512vl(auVar115,auVar119);
        auVar98 = vfmadd213ps_fma(auVar118,auVar111,auVar104);
        auVar228 = vfmadd213ps_fma(auVar116,auVar111,auVar105);
        auVar115 = vfmadd213ps_avx512vl(auVar109,auVar111,auVar110);
        auVar101 = vfmadd213ps_avx512vl(auVar102,ZEXT1632(auVar22),auVar106);
        auVar99 = vfnmadd213ps_fma(auVar118,auVar111,auVar104);
        auVar104 = ZEXT1632(auVar22);
        auVar97 = vfmadd213ps_fma(auVar103,auVar104,auVar107);
        auVar93 = vfnmadd213ps_fma(auVar116,auVar111,auVar105);
        auVar23 = vfmadd213ps_fma(auVar117,auVar104,auVar114);
        auVar118 = vfnmadd231ps_avx512vl(auVar110,auVar111,auVar109);
        auVar151 = vfnmadd213ps_fma(auVar102,auVar104,auVar106);
        auVar152 = vfnmadd213ps_fma(auVar103,auVar104,auVar107);
        auVar153 = vfnmadd231ps_fma(auVar114,ZEXT1632(auVar22),auVar117);
        auVar116 = vsubps_avx512vl(auVar101,ZEXT1632(auVar99));
        auVar117 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar93));
        auVar102 = vsubps_avx512vl(ZEXT1632(auVar23),auVar118);
        auVar103 = vmulps_avx512vl(auVar117,auVar118);
        auVar24 = vfmsub231ps_fma(auVar103,ZEXT1632(auVar93),auVar102);
        auVar114._4_4_ = auVar99._4_4_ * auVar102._4_4_;
        auVar114._0_4_ = auVar99._0_4_ * auVar102._0_4_;
        auVar114._8_4_ = auVar99._8_4_ * auVar102._8_4_;
        auVar114._12_4_ = auVar99._12_4_ * auVar102._12_4_;
        auVar114._16_4_ = auVar102._16_4_ * 0.0;
        auVar114._20_4_ = auVar102._20_4_ * 0.0;
        auVar114._24_4_ = auVar102._24_4_ * 0.0;
        auVar114._28_4_ = auVar102._28_4_;
        auVar102 = vfmsub231ps_avx512vl(auVar114,auVar118,auVar116);
        auVar104._4_4_ = auVar93._4_4_ * auVar116._4_4_;
        auVar104._0_4_ = auVar93._0_4_ * auVar116._0_4_;
        auVar104._8_4_ = auVar93._8_4_ * auVar116._8_4_;
        auVar104._12_4_ = auVar93._12_4_ * auVar116._12_4_;
        auVar104._16_4_ = auVar116._16_4_ * 0.0;
        auVar104._20_4_ = auVar116._20_4_ * 0.0;
        auVar104._24_4_ = auVar116._24_4_ * 0.0;
        auVar104._28_4_ = auVar116._28_4_;
        auVar95 = vfmsub231ps_fma(auVar104,ZEXT1632(auVar99),auVar117);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar119,auVar102);
        auVar117 = vfmadd231ps_avx512vl(auVar117,auVar119,ZEXT1632(auVar24));
        auVar108 = ZEXT1632(auVar100);
        uVar81 = vcmpps_avx512vl(auVar117,auVar108,2);
        bVar80 = (byte)uVar81;
        fVar91 = (float)((uint)(bVar80 & 1) * auVar98._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar151._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        fVar141 = (float)((uint)bVar13 * auVar98._4_4_ | (uint)!bVar13 * auVar151._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        fVar143 = (float)((uint)bVar13 * auVar98._8_4_ | (uint)!bVar13 * auVar151._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        fVar146 = (float)((uint)bVar13 * auVar98._12_4_ | (uint)!bVar13 * auVar151._12_4_);
        auVar103 = ZEXT1632(CONCAT412(fVar146,CONCAT48(fVar143,CONCAT44(fVar141,fVar91))));
        fVar92 = (float)((uint)(bVar80 & 1) * auVar228._0_4_ |
                        (uint)!(bool)(bVar80 & 1) * auVar152._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        fVar142 = (float)((uint)bVar13 * auVar228._4_4_ | (uint)!bVar13 * auVar152._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        fVar144 = (float)((uint)bVar13 * auVar228._8_4_ | (uint)!bVar13 * auVar152._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        fVar147 = (float)((uint)bVar13 * auVar228._12_4_ | (uint)!bVar13 * auVar152._12_4_);
        auVar114 = ZEXT1632(CONCAT412(fVar147,CONCAT48(fVar144,CONCAT44(fVar142,fVar92))));
        auVar109._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar115._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar153._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar109._4_4_ = (float)((uint)bVar13 * auVar115._4_4_ | (uint)!bVar13 * auVar153._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar109._8_4_ = (float)((uint)bVar13 * auVar115._8_4_ | (uint)!bVar13 * auVar153._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar109._12_4_ = (float)((uint)bVar13 * auVar115._12_4_ | (uint)!bVar13 * auVar153._12_4_);
        fVar196 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar115._16_4_);
        auVar109._16_4_ = fVar196;
        fVar187 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar115._20_4_);
        auVar109._20_4_ = fVar187;
        fVar197 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar115._24_4_);
        auVar109._24_4_ = fVar197;
        iVar1 = (uint)(byte)(uVar81 >> 7) * auVar115._28_4_;
        auVar109._28_4_ = iVar1;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar99),auVar101);
        auVar121._0_4_ =
             (uint)(bVar80 & 1) * auVar116._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar24._0_4_;
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar121._4_4_ = (uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar24._4_4_;
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar121._8_4_ = (uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar24._8_4_;
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar121._12_4_ = (uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar24._12_4_;
        auVar121._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar116._16_4_;
        auVar121._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar116._20_4_;
        auVar121._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar116._24_4_;
        auVar121._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar97));
        auVar122._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar116._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar228._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar122._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar228._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar122._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar228._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar122._12_4_ = (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar228._12_4_);
        fVar198 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar116._16_4_);
        auVar122._16_4_ = fVar198;
        fVar174 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar116._20_4_);
        auVar122._20_4_ = fVar174;
        fVar186 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar116._24_4_);
        auVar122._24_4_ = fVar186;
        auVar122._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar116._28_4_;
        auVar116 = vblendmps_avx512vl(auVar118,ZEXT1632(auVar23));
        auVar123._0_4_ =
             (float)((uint)(bVar80 & 1) * auVar116._0_4_ |
                    (uint)!(bool)(bVar80 & 1) * auVar115._0_4_);
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar123._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar115._4_4_);
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar123._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar115._8_4_);
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar123._12_4_ = (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar115._12_4_);
        bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
        auVar123._16_4_ = (float)((uint)bVar13 * auVar116._16_4_ | (uint)!bVar13 * auVar115._16_4_);
        bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
        auVar123._20_4_ = (float)((uint)bVar13 * auVar116._20_4_ | (uint)!bVar13 * auVar115._20_4_);
        bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
        auVar123._24_4_ = (float)((uint)bVar13 * auVar116._24_4_ | (uint)!bVar13 * auVar115._24_4_);
        bVar13 = SUB81(uVar81 >> 7,0);
        auVar123._28_4_ = (uint)bVar13 * auVar116._28_4_ | (uint)!bVar13 * auVar115._28_4_;
        auVar124._0_4_ =
             (uint)(bVar80 & 1) * (int)auVar99._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar101._0_4_;
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar124._4_4_ = (uint)bVar13 * (int)auVar99._4_4_ | (uint)!bVar13 * auVar101._4_4_;
        bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar124._8_4_ = (uint)bVar13 * (int)auVar99._8_4_ | (uint)!bVar13 * auVar101._8_4_;
        bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar124._12_4_ = (uint)bVar13 * (int)auVar99._12_4_ | (uint)!bVar13 * auVar101._12_4_;
        auVar124._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar101._16_4_;
        auVar124._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar101._20_4_;
        auVar124._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar101._24_4_;
        auVar124._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar101._28_4_;
        bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
        bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
        bVar16 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar125._0_4_ =
             (uint)(bVar80 & 1) * auVar118._0_4_ | (uint)!(bool)(bVar80 & 1) * auVar23._0_4_;
        bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
        auVar125._4_4_ = (uint)bVar14 * auVar118._4_4_ | (uint)!bVar14 * auVar23._4_4_;
        bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
        auVar125._8_4_ = (uint)bVar14 * auVar118._8_4_ | (uint)!bVar14 * auVar23._8_4_;
        bVar14 = (bool)((byte)(uVar81 >> 3) & 1);
        auVar125._12_4_ = (uint)bVar14 * auVar118._12_4_ | (uint)!bVar14 * auVar23._12_4_;
        auVar125._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar118._16_4_;
        auVar125._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar118._20_4_;
        auVar125._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar118._24_4_;
        iVar2 = (uint)(byte)(uVar81 >> 7) * auVar118._28_4_;
        auVar125._28_4_ = iVar2;
        auVar104 = vsubps_avx512vl(auVar124,auVar103);
        auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar16 * (int)auVar93._12_4_ |
                                                 (uint)!bVar16 * auVar97._12_4_,
                                                 CONCAT48((uint)bVar15 * (int)auVar93._8_4_ |
                                                          (uint)!bVar15 * auVar97._8_4_,
                                                          CONCAT44((uint)bVar13 * (int)auVar93._4_4_
                                                                   | (uint)!bVar13 * auVar97._4_4_,
                                                                   (uint)(bVar80 & 1) *
                                                                   (int)auVar93._0_4_ |
                                                                   (uint)!(bool)(bVar80 & 1) *
                                                                   auVar97._0_4_)))),auVar114);
        auVar116 = vsubps_avx(auVar125,auVar109);
        auVar115 = vsubps_avx(auVar103,auVar121);
        auVar101 = vsubps_avx(auVar114,auVar122);
        auVar102 = vsubps_avx(auVar109,auVar123);
        auVar105._4_4_ = auVar116._4_4_ * fVar141;
        auVar105._0_4_ = auVar116._0_4_ * fVar91;
        auVar105._8_4_ = auVar116._8_4_ * fVar143;
        auVar105._12_4_ = auVar116._12_4_ * fVar146;
        auVar105._16_4_ = auVar116._16_4_ * 0.0;
        auVar105._20_4_ = auVar116._20_4_ * 0.0;
        auVar105._24_4_ = auVar116._24_4_ * 0.0;
        auVar105._28_4_ = iVar2;
        auVar98 = vfmsub231ps_fma(auVar105,auVar109,auVar104);
        auVar106._4_4_ = fVar142 * auVar104._4_4_;
        auVar106._0_4_ = fVar92 * auVar104._0_4_;
        auVar106._8_4_ = fVar144 * auVar104._8_4_;
        auVar106._12_4_ = fVar147 * auVar104._12_4_;
        auVar106._16_4_ = auVar104._16_4_ * 0.0;
        auVar106._20_4_ = auVar104._20_4_ * 0.0;
        auVar106._24_4_ = auVar104._24_4_ * 0.0;
        auVar106._28_4_ = auVar117._28_4_;
        auVar228 = vfmsub231ps_fma(auVar106,auVar103,auVar118);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar228),auVar108,ZEXT1632(auVar98));
        auVar190._0_4_ = auVar118._0_4_ * auVar109._0_4_;
        auVar190._4_4_ = auVar118._4_4_ * auVar109._4_4_;
        auVar190._8_4_ = auVar118._8_4_ * auVar109._8_4_;
        auVar190._12_4_ = auVar118._12_4_ * auVar109._12_4_;
        auVar190._16_4_ = auVar118._16_4_ * fVar196;
        auVar190._20_4_ = auVar118._20_4_ * fVar187;
        auVar190._24_4_ = auVar118._24_4_ * fVar197;
        auVar190._28_4_ = 0;
        auVar98 = vfmsub231ps_fma(auVar190,auVar114,auVar116);
        auVar105 = vfmadd231ps_avx512vl(auVar117,auVar108,ZEXT1632(auVar98));
        auVar117 = vmulps_avx512vl(auVar102,auVar121);
        auVar117 = vfmsub231ps_avx512vl(auVar117,auVar115,auVar123);
        auVar107._4_4_ = auVar101._4_4_ * auVar123._4_4_;
        auVar107._0_4_ = auVar101._0_4_ * auVar123._0_4_;
        auVar107._8_4_ = auVar101._8_4_ * auVar123._8_4_;
        auVar107._12_4_ = auVar101._12_4_ * auVar123._12_4_;
        auVar107._16_4_ = auVar101._16_4_ * auVar123._16_4_;
        auVar107._20_4_ = auVar101._20_4_ * auVar123._20_4_;
        auVar107._24_4_ = auVar101._24_4_ * auVar123._24_4_;
        auVar107._28_4_ = auVar123._28_4_;
        auVar98 = vfmsub231ps_fma(auVar107,auVar122,auVar102);
        auVar191._0_4_ = auVar122._0_4_ * auVar115._0_4_;
        auVar191._4_4_ = auVar122._4_4_ * auVar115._4_4_;
        auVar191._8_4_ = auVar122._8_4_ * auVar115._8_4_;
        auVar191._12_4_ = auVar122._12_4_ * auVar115._12_4_;
        auVar191._16_4_ = fVar198 * auVar115._16_4_;
        auVar191._20_4_ = fVar174 * auVar115._20_4_;
        auVar191._24_4_ = fVar186 * auVar115._24_4_;
        auVar191._28_4_ = 0;
        auVar228 = vfmsub231ps_fma(auVar191,auVar101,auVar121);
        auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar228),auVar108,auVar117);
        auVar106 = vfmadd231ps_avx512vl(auVar117,auVar108,ZEXT1632(auVar98));
        auVar117 = vmaxps_avx(auVar105,auVar106);
        uVar165 = vcmpps_avx512vl(auVar117,auVar108,2);
        bVar90 = bVar90 & (byte)uVar165;
        in_ZMM20 = ZEXT3264(local_600);
        in_ZMM21 = ZEXT3264(local_620);
        auVar227 = ZEXT3264(local_560);
        auVar225 = ZEXT3264(local_6a0);
        if (bVar90 == 0) {
          bVar90 = 0;
          auVar211 = ZEXT3264(auVar183);
          auVar185 = ZEXT3264(auVar126);
        }
        else {
          auVar38._4_4_ = auVar102._4_4_ * auVar118._4_4_;
          auVar38._0_4_ = auVar102._0_4_ * auVar118._0_4_;
          auVar38._8_4_ = auVar102._8_4_ * auVar118._8_4_;
          auVar38._12_4_ = auVar102._12_4_ * auVar118._12_4_;
          auVar38._16_4_ = auVar102._16_4_ * auVar118._16_4_;
          auVar38._20_4_ = auVar102._20_4_ * auVar118._20_4_;
          auVar38._24_4_ = auVar102._24_4_ * auVar118._24_4_;
          auVar38._28_4_ = auVar117._28_4_;
          auVar97 = vfmsub231ps_fma(auVar38,auVar101,auVar116);
          auVar39._4_4_ = auVar116._4_4_ * auVar115._4_4_;
          auVar39._0_4_ = auVar116._0_4_ * auVar115._0_4_;
          auVar39._8_4_ = auVar116._8_4_ * auVar115._8_4_;
          auVar39._12_4_ = auVar116._12_4_ * auVar115._12_4_;
          auVar39._16_4_ = auVar116._16_4_ * auVar115._16_4_;
          auVar39._20_4_ = auVar116._20_4_ * auVar115._20_4_;
          auVar39._24_4_ = auVar116._24_4_ * auVar115._24_4_;
          auVar39._28_4_ = auVar116._28_4_;
          auVar228 = vfmsub231ps_fma(auVar39,auVar104,auVar102);
          auVar40._4_4_ = auVar101._4_4_ * auVar104._4_4_;
          auVar40._0_4_ = auVar101._0_4_ * auVar104._0_4_;
          auVar40._8_4_ = auVar101._8_4_ * auVar104._8_4_;
          auVar40._12_4_ = auVar101._12_4_ * auVar104._12_4_;
          auVar40._16_4_ = auVar101._16_4_ * auVar104._16_4_;
          auVar40._20_4_ = auVar101._20_4_ * auVar104._20_4_;
          auVar40._24_4_ = auVar101._24_4_ * auVar104._24_4_;
          auVar40._28_4_ = auVar101._28_4_;
          auVar23 = vfmsub231ps_fma(auVar40,auVar115,auVar118);
          auVar98 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar228),ZEXT1632(auVar23));
          auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar98),ZEXT1632(auVar97),auVar108);
          auVar118 = vrcp14ps_avx512vl(auVar117);
          auVar29._8_4_ = 0x3f800000;
          auVar29._0_8_ = &DAT_3f8000003f800000;
          auVar29._12_4_ = 0x3f800000;
          auVar29._16_4_ = 0x3f800000;
          auVar29._20_4_ = 0x3f800000;
          auVar29._24_4_ = 0x3f800000;
          auVar29._28_4_ = 0x3f800000;
          auVar116 = vfnmadd213ps_avx512vl(auVar118,auVar117,auVar29);
          auVar98 = vfmadd132ps_fma(auVar116,auVar118,auVar118);
          auVar41._4_4_ = auVar23._4_4_ * auVar109._4_4_;
          auVar41._0_4_ = auVar23._0_4_ * auVar109._0_4_;
          auVar41._8_4_ = auVar23._8_4_ * auVar109._8_4_;
          auVar41._12_4_ = auVar23._12_4_ * auVar109._12_4_;
          auVar41._16_4_ = fVar196 * 0.0;
          auVar41._20_4_ = fVar187 * 0.0;
          auVar41._24_4_ = fVar197 * 0.0;
          auVar41._28_4_ = iVar1;
          auVar228 = vfmadd231ps_fma(auVar41,auVar114,ZEXT1632(auVar228));
          auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),auVar103,ZEXT1632(auVar97));
          fVar187 = auVar98._0_4_;
          fVar196 = auVar98._4_4_;
          fVar197 = auVar98._8_4_;
          fVar198 = auVar98._12_4_;
          auVar118 = ZEXT1632(CONCAT412(auVar228._12_4_ * fVar198,
                                        CONCAT48(auVar228._8_4_ * fVar197,
                                                 CONCAT44(auVar228._4_4_ * fVar196,
                                                          auVar228._0_4_ * fVar187))));
          auVar214._4_4_ = uVar85;
          auVar214._0_4_ = uVar85;
          auVar214._8_4_ = uVar85;
          auVar214._12_4_ = uVar85;
          auVar214._16_4_ = uVar85;
          auVar214._20_4_ = uVar85;
          auVar214._24_4_ = uVar85;
          auVar214._28_4_ = uVar85;
          uVar165 = vcmpps_avx512vl(auVar214,auVar118,2);
          uVar150 = *(undefined4 *)(ray + k * 4 + 0x100);
          auVar30._4_4_ = uVar150;
          auVar30._0_4_ = uVar150;
          auVar30._8_4_ = uVar150;
          auVar30._12_4_ = uVar150;
          auVar30._16_4_ = uVar150;
          auVar30._20_4_ = uVar150;
          auVar30._24_4_ = uVar150;
          auVar30._28_4_ = uVar150;
          uVar26 = vcmpps_avx512vl(auVar118,auVar30,2);
          bVar90 = (byte)uVar165 & (byte)uVar26 & bVar90;
          if (bVar90 == 0) {
            bVar90 = 0;
            auVar211 = ZEXT3264(auVar183);
            auVar185 = ZEXT3264(auVar126);
          }
          else {
            uVar165 = vcmpps_avx512vl(auVar117,auVar108,4);
            if ((bVar90 & (byte)uVar165) == 0) {
              bVar90 = 0;
              auVar211 = ZEXT3264(auVar183);
              auVar185 = ZEXT3264(auVar126);
            }
            else {
              bVar90 = bVar90 & (byte)uVar165;
              fVar174 = auVar105._0_4_ * fVar187;
              fVar186 = auVar105._4_4_ * fVar196;
              auVar126._4_4_ = fVar186;
              auVar126._0_4_ = fVar174;
              fVar91 = auVar105._8_4_ * fVar197;
              auVar126._8_4_ = fVar91;
              fVar92 = auVar105._12_4_ * fVar198;
              auVar126._12_4_ = fVar92;
              fVar141 = auVar105._16_4_ * 0.0;
              auVar126._16_4_ = fVar141;
              fVar142 = auVar105._20_4_ * 0.0;
              auVar126._20_4_ = fVar142;
              fVar143 = auVar105._24_4_ * 0.0;
              auVar126._24_4_ = fVar143;
              auVar126._28_4_ = auVar105._28_4_;
              fVar187 = auVar106._0_4_ * fVar187;
              fVar196 = auVar106._4_4_ * fVar196;
              auVar183._4_4_ = fVar196;
              auVar183._0_4_ = fVar187;
              fVar197 = auVar106._8_4_ * fVar197;
              auVar183._8_4_ = fVar197;
              fVar198 = auVar106._12_4_ * fVar198;
              auVar183._12_4_ = fVar198;
              fVar144 = auVar106._16_4_ * 0.0;
              auVar183._16_4_ = fVar144;
              fVar146 = auVar106._20_4_ * 0.0;
              auVar183._20_4_ = fVar146;
              fVar147 = auVar106._24_4_ * 0.0;
              auVar183._24_4_ = fVar147;
              auVar183._28_4_ = auVar106._28_4_;
              auVar204._8_4_ = 0x3f800000;
              auVar204._0_8_ = &DAT_3f8000003f800000;
              auVar204._12_4_ = 0x3f800000;
              auVar204._16_4_ = 0x3f800000;
              auVar204._20_4_ = 0x3f800000;
              auVar204._24_4_ = 0x3f800000;
              auVar204._28_4_ = 0x3f800000;
              auVar126 = vsubps_avx(auVar204,auVar126);
              bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar81 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
              bVar19 = SUB81(uVar81 >> 7,0);
              auVar211 = ZEXT3264(CONCAT428((uint)bVar19 * auVar105._28_4_ |
                                            (uint)!bVar19 * auVar126._28_4_,
                                            CONCAT424((uint)bVar18 * (int)fVar143 |
                                                      (uint)!bVar18 * auVar126._24_4_,
                                                      CONCAT420((uint)bVar17 * (int)fVar142 |
                                                                (uint)!bVar17 * auVar126._20_4_,
                                                                CONCAT416((uint)bVar16 *
                                                                          (int)fVar141 |
                                                                          (uint)!bVar16 *
                                                                          auVar126._16_4_,
                                                                          CONCAT412((uint)bVar15 *
                                                                                    (int)fVar92 |
                                                                                    (uint)!bVar15 *
                                                                                    auVar126._12_4_,
                                                                                    CONCAT48((uint)
                                                  bVar14 * (int)fVar91 |
                                                  (uint)!bVar14 * auVar126._8_4_,
                                                  CONCAT44((uint)bVar13 * (int)fVar186 |
                                                           (uint)!bVar13 * auVar126._4_4_,
                                                           (uint)(bVar80 & 1) * (int)fVar174 |
                                                           (uint)!(bool)(bVar80 & 1) *
                                                           auVar126._0_4_))))))));
              auVar126 = vsubps_avx(auVar204,auVar183);
              bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
              bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
              bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
              bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
              bVar17 = (bool)((byte)(uVar81 >> 5) & 1);
              bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
              bVar19 = SUB81(uVar81 >> 7,0);
              local_340._4_4_ = (uint)bVar13 * (int)fVar196 | (uint)!bVar13 * auVar126._4_4_;
              local_340._0_4_ =
                   (uint)(bVar80 & 1) * (int)fVar187 | (uint)!(bool)(bVar80 & 1) * auVar126._0_4_;
              local_340._8_4_ = (uint)bVar14 * (int)fVar197 | (uint)!bVar14 * auVar126._8_4_;
              local_340._12_4_ = (uint)bVar15 * (int)fVar198 | (uint)!bVar15 * auVar126._12_4_;
              local_340._16_4_ = (uint)bVar16 * (int)fVar144 | (uint)!bVar16 * auVar126._16_4_;
              local_340._20_4_ = (uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar126._20_4_;
              local_340._24_4_ = (uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar126._24_4_;
              local_340._28_4_ = (uint)bVar19 * auVar106._28_4_ | (uint)!bVar19 * auVar126._28_4_;
              auVar185 = ZEXT3264(auVar118);
            }
          }
        }
        auVar231 = ZEXT3264(local_660);
        auVar230 = ZEXT3264(local_640);
        if (bVar90 != 0) {
          auVar126 = vsubps_avx(ZEXT1632(auVar22),auVar111);
          auVar117 = auVar211._0_32_;
          auVar98 = vfmadd213ps_fma(auVar126,auVar117,auVar111);
          uVar150 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
          auVar111._4_4_ = uVar150;
          auVar111._0_4_ = uVar150;
          auVar111._8_4_ = uVar150;
          auVar111._12_4_ = uVar150;
          auVar111._16_4_ = uVar150;
          auVar111._20_4_ = uVar150;
          auVar111._24_4_ = uVar150;
          auVar111._28_4_ = uVar150;
          auVar126 = vmulps_avx512vl(ZEXT1632(CONCAT412(auVar98._12_4_ + auVar98._12_4_,
                                                        CONCAT48(auVar98._8_4_ + auVar98._8_4_,
                                                                 CONCAT44(auVar98._4_4_ +
                                                                          auVar98._4_4_,
                                                                          auVar98._0_4_ +
                                                                          auVar98._0_4_)))),auVar111
                                    );
          auVar183 = auVar185._0_32_;
          uVar165 = vcmpps_avx512vl(auVar183,auVar126,6);
          bVar90 = bVar90 & (byte)uVar165;
          if (bVar90 != 0) {
            auVar158._8_4_ = 0xbf800000;
            auVar158._0_8_ = 0xbf800000bf800000;
            auVar158._12_4_ = 0xbf800000;
            auVar158._16_4_ = 0xbf800000;
            auVar158._20_4_ = 0xbf800000;
            auVar158._24_4_ = 0xbf800000;
            auVar158._28_4_ = 0xbf800000;
            auVar31._8_4_ = 0x40000000;
            auVar31._0_8_ = 0x4000000040000000;
            auVar31._12_4_ = 0x40000000;
            auVar31._16_4_ = 0x40000000;
            auVar31._20_4_ = 0x40000000;
            auVar31._24_4_ = 0x40000000;
            auVar31._28_4_ = 0x40000000;
            local_4a0 = vfmadd132ps_avx512vl(local_340,auVar158,auVar31);
            local_340 = local_4a0;
            auVar126 = local_340;
            local_460 = 0;
            local_340 = auVar126;
            if ((pGVar86->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
              fVar187 = 1.0 / auVar112._0_4_;
              local_400[0] = fVar187 * (auVar211._0_4_ + 0.0);
              local_400[1] = fVar187 * (auVar211._4_4_ + 1.0);
              local_400[2] = fVar187 * (auVar211._8_4_ + 2.0);
              local_400[3] = fVar187 * (auVar211._12_4_ + 3.0);
              fStack_3f0 = fVar187 * (auVar211._16_4_ + 4.0);
              fStack_3ec = fVar187 * (auVar211._20_4_ + 5.0);
              fStack_3e8 = fVar187 * (auVar211._24_4_ + 6.0);
              fStack_3e4 = auVar211._28_4_ + 7.0;
              local_340._0_8_ = local_4a0._0_8_;
              local_340._8_8_ = local_4a0._8_8_;
              local_340._16_8_ = local_4a0._16_8_;
              local_340._24_8_ = local_4a0._24_8_;
              local_3e0 = local_340._0_8_;
              uStack_3d8 = local_340._8_8_;
              uStack_3d0 = local_340._16_8_;
              uStack_3c8 = local_340._24_8_;
              local_3c0 = auVar183;
              auVar159._8_4_ = 0x7f800000;
              auVar159._0_8_ = 0x7f8000007f800000;
              auVar159._12_4_ = 0x7f800000;
              auVar159._16_4_ = 0x7f800000;
              auVar159._20_4_ = 0x7f800000;
              auVar159._24_4_ = 0x7f800000;
              auVar159._28_4_ = 0x7f800000;
              auVar126 = vblendmps_avx512vl(auVar159,auVar183);
              auVar127._0_4_ =
                   (uint)(bVar90 & 1) * auVar126._0_4_ | (uint)!(bool)(bVar90 & 1) * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 1 & 1);
              auVar127._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 2 & 1);
              auVar127._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 3 & 1);
              auVar127._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 4 & 1);
              auVar127._16_4_ = (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 5 & 1);
              auVar127._20_4_ = (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * 0x7f800000;
              bVar13 = (bool)(bVar90 >> 6 & 1);
              auVar127._24_4_ = (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * 0x7f800000;
              auVar127._28_4_ =
                   (uint)(bVar90 >> 7) * auVar126._28_4_ | (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
              auVar126 = vshufps_avx(auVar127,auVar127,0xb1);
              auVar126 = vminps_avx(auVar127,auVar126);
              auVar118 = vshufpd_avx(auVar126,auVar126,5);
              auVar126 = vminps_avx(auVar126,auVar118);
              auVar118 = vpermpd_avx2(auVar126,0x4e);
              auVar126 = vminps_avx(auVar126,auVar118);
              uVar165 = vcmpps_avx512vl(auVar127,auVar126,0);
              bVar79 = (byte)uVar165 & bVar90;
              bVar80 = bVar90;
              if (bVar79 != 0) {
                bVar80 = bVar79;
              }
              uVar83 = 0;
              for (uVar82 = (uint)bVar80; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000) {
                uVar83 = uVar83 + 1;
              }
              uVar81 = (ulong)uVar83;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar86->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar187 = local_400[uVar81];
                uVar150 = *(undefined4 *)((long)&local_3e0 + uVar81 * 4);
                fVar197 = 1.0 - fVar187;
                fVar196 = fVar197 * fVar197 * -3.0;
                auVar98 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),
                                          ZEXT416((uint)(fVar187 * fVar197)),ZEXT416(0xc0000000));
                auVar228 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar197)),
                                           ZEXT416((uint)(fVar187 * fVar187)),ZEXT416(0x40000000));
                fVar197 = auVar98._0_4_ * 3.0;
                fVar198 = auVar228._0_4_ * 3.0;
                fVar174 = fVar187 * fVar187 * 3.0;
                auVar211 = ZEXT3264(auVar117);
                auVar200._0_4_ = fVar174 * local_6c0;
                auVar200._4_4_ = fVar174 * fStack_6bc;
                auVar200._8_4_ = fVar174 * fStack_6b8;
                auVar200._12_4_ = fVar174 * fStack_6b4;
                auVar170._4_4_ = fVar198;
                auVar170._0_4_ = fVar198;
                auVar170._8_4_ = fVar198;
                auVar170._12_4_ = fVar198;
                auVar98 = vfmadd132ps_fma(auVar170,auVar200,*pauVar4);
                auVar179._4_4_ = fVar197;
                auVar179._0_4_ = fVar197;
                auVar179._8_4_ = fVar197;
                auVar179._12_4_ = fVar197;
                auVar98 = vfmadd132ps_fma(auVar179,auVar98,*pauVar3);
                auVar171._4_4_ = fVar196;
                auVar171._0_4_ = fVar196;
                auVar171._8_4_ = fVar196;
                auVar171._12_4_ = fVar196;
                auVar98 = vfmadd213ps_fma(auVar171,auVar96,auVar98);
                *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar81 * 4);
                auVar185 = ZEXT3264(auVar183);
                *(int *)(ray + k * 4 + 0x180) = auVar98._0_4_;
                uVar11 = vextractps_avx(auVar98,1);
                *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                uVar11 = vextractps_avx(auVar98,2);
                *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                *(float *)(ray + k * 4 + 0x1e0) = fVar187;
                *(undefined4 *)(ray + k * 4 + 0x200) = uVar150;
                *(uint *)(ray + k * 4 + 0x220) = uVar9;
                *(uint *)(ray + k * 4 + 0x240) = uVar87;
                *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
              }
              else {
                local_3a0 = vpbroadcastd_avx512vl();
                local_520 = vpbroadcastd_avx512vl();
                local_5a0 = (undefined4)uVar25;
                uStack_59c = (undefined4)((ulong)uVar25 >> 0x20);
                local_5c0 = local_6c0;
                fStack_5bc = fStack_6bc;
                fStack_5b8 = fStack_6b8;
                fStack_5b4 = fStack_6b4;
                local_5b0 = uVar67;
                uStack_5a8 = uVar68;
                uStack_598 = uVar66;
                local_4c0 = auVar117;
                local_480 = auVar183;
                local_45c = iVar10;
                local_450 = auVar96;
                local_440 = uVar25;
                uStack_438 = uVar66;
                local_430 = uVar67;
                uStack_428 = uVar68;
                local_410 = bVar90;
                do {
                  auVar228 = auVar229._0_16_;
                  local_380._0_4_ = *(undefined4 *)(ray + k * 4 + 0x100);
                  local_260 = local_400[uVar81];
                  local_240 = *(undefined4 *)((long)&local_3e0 + uVar81 * 4);
                  *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar81 * 4);
                  local_6f0.context = context->user;
                  fVar196 = 1.0 - local_260;
                  fVar187 = fVar196 * fVar196 * -3.0;
                  auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                            ZEXT416((uint)(local_260 * fVar196)),ZEXT416(0xc0000000)
                                           );
                  auVar98 = vfmsub132ss_fma(ZEXT416((uint)(local_260 * fVar196)),
                                            ZEXT416((uint)(local_260 * local_260)),
                                            ZEXT416(0x40000000));
                  fVar196 = auVar94._0_4_ * 3.0;
                  fVar197 = auVar98._0_4_ * 3.0;
                  fVar198 = local_260 * local_260 * 3.0;
                  auVar203._0_4_ = fVar198 * local_5c0;
                  auVar203._4_4_ = fVar198 * fStack_5bc;
                  auVar203._8_4_ = fVar198 * fStack_5b8;
                  auVar203._12_4_ = fVar198 * fStack_5b4;
                  auVar156._4_4_ = fVar197;
                  auVar156._0_4_ = fVar197;
                  auVar156._8_4_ = fVar197;
                  auVar156._12_4_ = fVar197;
                  auVar76._8_8_ = uStack_5a8;
                  auVar76._0_8_ = local_5b0;
                  auVar94 = vfmadd132ps_fma(auVar156,auVar203,auVar76);
                  auVar182._4_4_ = fVar196;
                  auVar182._0_4_ = fVar196;
                  auVar182._8_4_ = fVar196;
                  auVar182._12_4_ = fVar196;
                  auVar77._4_4_ = uStack_59c;
                  auVar77._0_4_ = local_5a0;
                  auVar77._8_8_ = uStack_598;
                  auVar94 = vfmadd132ps_fma(auVar182,auVar94,auVar77);
                  auVar157._4_4_ = fVar187;
                  auVar157._0_4_ = fVar187;
                  auVar157._8_4_ = fVar187;
                  auVar157._12_4_ = fVar187;
                  auVar94 = vfmadd213ps_fma(auVar157,auVar96,auVar94);
                  local_2c0 = auVar94._0_4_;
                  auVar195._8_4_ = 1;
                  auVar195._0_8_ = 0x100000001;
                  auVar195._12_4_ = 1;
                  auVar195._16_4_ = 1;
                  auVar195._20_4_ = 1;
                  auVar195._24_4_ = 1;
                  auVar195._28_4_ = 1;
                  local_2a0 = vpermps_avx2(auVar195,ZEXT1632(auVar94));
                  auVar207._8_4_ = 2;
                  auVar207._0_8_ = 0x200000002;
                  auVar207._12_4_ = 2;
                  auVar207._16_4_ = 2;
                  auVar207._20_4_ = 2;
                  auVar207._24_4_ = 2;
                  auVar207._28_4_ = 2;
                  local_280 = vpermps_avx2(auVar207,ZEXT1632(auVar94));
                  iStack_2bc = local_2c0;
                  iStack_2b8 = local_2c0;
                  iStack_2b4 = local_2c0;
                  iStack_2b0 = local_2c0;
                  iStack_2ac = local_2c0;
                  iStack_2a8 = local_2c0;
                  iStack_2a4 = local_2c0;
                  fStack_25c = local_260;
                  fStack_258 = local_260;
                  fStack_254 = local_260;
                  fStack_250 = local_260;
                  fStack_24c = local_260;
                  fStack_248 = local_260;
                  fStack_244 = local_260;
                  uStack_23c = local_240;
                  uStack_238 = local_240;
                  uStack_234 = local_240;
                  uStack_230 = local_240;
                  uStack_22c = local_240;
                  uStack_228 = local_240;
                  uStack_224 = local_240;
                  local_220 = local_520._0_8_;
                  uStack_218 = local_520._8_8_;
                  uStack_210 = local_520._16_8_;
                  uStack_208 = local_520._24_8_;
                  local_200 = local_3a0;
                  auVar126 = vpcmpeqd_avx2(local_3a0,local_3a0);
                  local_6a8[1] = auVar126;
                  *local_6a8 = auVar126;
                  local_1e0 = (local_6f0.context)->instID[0];
                  uStack_1dc = local_1e0;
                  uStack_1d8 = local_1e0;
                  uStack_1d4 = local_1e0;
                  uStack_1d0 = local_1e0;
                  uStack_1cc = local_1e0;
                  uStack_1c8 = local_1e0;
                  uStack_1c4 = local_1e0;
                  local_1c0 = (local_6f0.context)->instPrimID[0];
                  uStack_1bc = local_1c0;
                  uStack_1b8 = local_1c0;
                  uStack_1b4 = local_1c0;
                  uStack_1b0 = local_1c0;
                  uStack_1ac = local_1c0;
                  uStack_1a8 = local_1c0;
                  uStack_1a4 = local_1c0;
                  local_5e0 = local_300._0_8_;
                  uStack_5d8 = local_300._8_8_;
                  uStack_5d0 = local_300._16_8_;
                  uStack_5c8 = local_300._24_8_;
                  local_6f0.valid = (int *)&local_5e0;
                  local_6f0.geometryUserPtr = pGVar86->userPtr;
                  local_6f0.hit = (RTCHitN *)&local_2c0;
                  local_6f0.N = 8;
                  local_500 = (uint)uVar81;
                  uStack_4fc = (uint)(uVar81 >> 0x20);
                  local_6f0.ray = (RTCRayN *)ray;
                  if (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    (*pGVar86->intersectionFilterN)(&local_6f0);
                    uVar81 = CONCAT44(uStack_4fc,local_500);
                    auVar232 = ZEXT1664(local_540._0_16_);
                    auVar231 = ZEXT3264(local_660);
                    auVar230 = ZEXT3264(local_640);
                    auVar225 = ZEXT3264(local_6a0);
                    auVar226 = ZEXT3264(local_680);
                    auVar227 = ZEXT3264(local_560);
                    in_ZMM21 = ZEXT3264(local_620);
                    in_ZMM20 = ZEXT3264(local_600);
                    auVar94 = vxorps_avx512vl(auVar228,auVar228);
                    auVar229 = ZEXT1664(auVar94);
                    uVar85 = local_580._0_4_;
                  }
                  auVar94 = auVar229._0_16_;
                  auVar72._8_8_ = uStack_5d8;
                  auVar72._0_8_ = local_5e0;
                  auVar72._16_8_ = uStack_5d0;
                  auVar72._24_8_ = uStack_5c8;
                  if (auVar72 == (undefined1  [32])0x0) {
LAB_01b9f0eb:
                    *(undefined4 *)(ray + k * 4 + 0x100) = local_380._0_4_;
                  }
                  else {
                    p_Var12 = context->args->filter;
                    if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar86->field_8).field_0x2 & 0x40) != 0)))) {
                      (*p_Var12)(&local_6f0);
                      uVar81 = CONCAT44(uStack_4fc,local_500);
                      auVar232 = ZEXT1664(local_540._0_16_);
                      auVar231 = ZEXT3264(local_660);
                      auVar230 = ZEXT3264(local_640);
                      auVar225 = ZEXT3264(local_6a0);
                      auVar226 = ZEXT3264(local_680);
                      auVar227 = ZEXT3264(local_560);
                      in_ZMM21 = ZEXT3264(local_620);
                      in_ZMM20 = ZEXT3264(local_600);
                      auVar94 = vxorps_avx512vl(auVar94,auVar94);
                      auVar229 = ZEXT1664(auVar94);
                      uVar85 = local_580._0_4_;
                    }
                    auVar73._8_8_ = uStack_5d8;
                    auVar73._0_8_ = local_5e0;
                    auVar73._16_8_ = uStack_5d0;
                    auVar73._24_8_ = uStack_5c8;
                    if (auVar73 == (undefined1  [32])0x0) goto LAB_01b9f0eb;
                    uVar84 = vptestmd_avx512vl(auVar73,auVar73);
                    iVar1 = *(int *)(local_6f0.hit + 4);
                    iVar2 = *(int *)(local_6f0.hit + 8);
                    iVar61 = *(int *)(local_6f0.hit + 0xc);
                    iVar62 = *(int *)(local_6f0.hit + 0x10);
                    iVar63 = *(int *)(local_6f0.hit + 0x14);
                    iVar64 = *(int *)(local_6f0.hit + 0x18);
                    iVar65 = *(int *)(local_6f0.hit + 0x1c);
                    bVar80 = (byte)uVar84;
                    bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                    bVar19 = SUB81(uVar84 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x180) =
                         (uint)(bVar80 & 1) * *(int *)local_6f0.hit |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x180);
                    *(uint *)(local_6f0.ray + 0x184) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x184);
                    *(uint *)(local_6f0.ray + 0x188) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x188);
                    *(uint *)(local_6f0.ray + 0x18c) =
                         (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x18c);
                    *(uint *)(local_6f0.ray + 400) =
                         (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 400);
                    *(uint *)(local_6f0.ray + 0x194) =
                         (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x194);
                    *(uint *)(local_6f0.ray + 0x198) =
                         (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x198);
                    *(uint *)(local_6f0.ray + 0x19c) =
                         (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x19c);
                    iVar1 = *(int *)(local_6f0.hit + 0x24);
                    iVar2 = *(int *)(local_6f0.hit + 0x28);
                    iVar61 = *(int *)(local_6f0.hit + 0x2c);
                    iVar62 = *(int *)(local_6f0.hit + 0x30);
                    iVar63 = *(int *)(local_6f0.hit + 0x34);
                    iVar64 = *(int *)(local_6f0.hit + 0x38);
                    iVar65 = *(int *)(local_6f0.hit + 0x3c);
                    bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                    bVar19 = SUB81(uVar84 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x1a0) =
                         (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x20) |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x1a0);
                    *(uint *)(local_6f0.ray + 0x1a4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1a4);
                    *(uint *)(local_6f0.ray + 0x1a8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1a8);
                    *(uint *)(local_6f0.ray + 0x1ac) =
                         (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ac);
                    *(uint *)(local_6f0.ray + 0x1b0) =
                         (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1b0);
                    *(uint *)(local_6f0.ray + 0x1b4) =
                         (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1b4);
                    *(uint *)(local_6f0.ray + 0x1b8) =
                         (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1b8);
                    *(uint *)(local_6f0.ray + 0x1bc) =
                         (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1bc);
                    iVar1 = *(int *)(local_6f0.hit + 0x44);
                    iVar2 = *(int *)(local_6f0.hit + 0x48);
                    iVar61 = *(int *)(local_6f0.hit + 0x4c);
                    iVar62 = *(int *)(local_6f0.hit + 0x50);
                    iVar63 = *(int *)(local_6f0.hit + 0x54);
                    iVar64 = *(int *)(local_6f0.hit + 0x58);
                    iVar65 = *(int *)(local_6f0.hit + 0x5c);
                    bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                    bVar19 = SUB81(uVar84 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x1c0) =
                         (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x40) |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x1c0);
                    *(uint *)(local_6f0.ray + 0x1c4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1c4);
                    *(uint *)(local_6f0.ray + 0x1c8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1c8);
                    *(uint *)(local_6f0.ray + 0x1cc) =
                         (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1cc);
                    *(uint *)(local_6f0.ray + 0x1d0) =
                         (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1d0);
                    *(uint *)(local_6f0.ray + 0x1d4) =
                         (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1d4);
                    *(uint *)(local_6f0.ray + 0x1d8) =
                         (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1d8);
                    *(uint *)(local_6f0.ray + 0x1dc) =
                         (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1dc);
                    iVar1 = *(int *)(local_6f0.hit + 100);
                    iVar2 = *(int *)(local_6f0.hit + 0x68);
                    iVar61 = *(int *)(local_6f0.hit + 0x6c);
                    iVar62 = *(int *)(local_6f0.hit + 0x70);
                    iVar63 = *(int *)(local_6f0.hit + 0x74);
                    iVar64 = *(int *)(local_6f0.hit + 0x78);
                    iVar65 = *(int *)(local_6f0.hit + 0x7c);
                    bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                    bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                    bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                    bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                    bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                    bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                    bVar19 = SUB81(uVar84 >> 7,0);
                    *(uint *)(local_6f0.ray + 0x1e0) =
                         (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x60) |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x1e0);
                    *(uint *)(local_6f0.ray + 0x1e4) =
                         (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1e4);
                    *(uint *)(local_6f0.ray + 0x1e8) =
                         (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1e8);
                    *(uint *)(local_6f0.ray + 0x1ec) =
                         (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ec);
                    *(uint *)(local_6f0.ray + 0x1f0) =
                         (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1f0);
                    *(uint *)(local_6f0.ray + 500) =
                         (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 500);
                    *(uint *)(local_6f0.ray + 0x1f8) =
                         (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1f8);
                    *(uint *)(local_6f0.ray + 0x1fc) =
                         (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1fc);
                    auVar139._0_4_ =
                         (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x80) |
                         (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x200);
                    bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                    auVar139._4_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x84) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x204);
                    bVar13 = (bool)((byte)(uVar84 >> 2) & 1);
                    auVar139._8_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x88) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x208);
                    bVar13 = (bool)((byte)(uVar84 >> 3) & 1);
                    auVar139._12_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x8c) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x20c);
                    bVar13 = (bool)((byte)(uVar84 >> 4) & 1);
                    auVar139._16_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x90) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x210);
                    bVar13 = (bool)((byte)(uVar84 >> 5) & 1);
                    auVar139._20_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x94) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x214);
                    bVar13 = (bool)((byte)(uVar84 >> 6) & 1);
                    auVar139._24_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x98) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x218);
                    bVar13 = SUB81(uVar84 >> 7,0);
                    auVar139._28_4_ =
                         (uint)bVar13 * *(int *)(local_6f0.hit + 0x9c) |
                         (uint)!bVar13 * *(int *)(local_6f0.ray + 0x21c);
                    *(undefined1 (*) [32])(local_6f0.ray + 0x200) = auVar139;
                    auVar126 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xa0));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x220) = auVar126;
                    auVar126 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xc0));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x240) = auVar126;
                    auVar126 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xe0));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x260) = auVar126;
                    auVar126 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0x100));
                    *(undefined1 (*) [32])(local_6f0.ray + 0x280) = auVar126;
                  }
                  auVar211 = ZEXT3264(auVar117);
                  auVar185 = ZEXT3264(auVar183);
                  auVar94 = auVar232._0_16_;
                  bVar80 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & bVar90;
                  uVar150 = *(undefined4 *)(ray + k * 4 + 0x100);
                  auVar37._4_4_ = uVar150;
                  auVar37._0_4_ = uVar150;
                  auVar37._8_4_ = uVar150;
                  auVar37._12_4_ = uVar150;
                  auVar37._16_4_ = uVar150;
                  auVar37._20_4_ = uVar150;
                  auVar37._24_4_ = uVar150;
                  auVar37._28_4_ = uVar150;
                  uVar165 = vcmpps_avx512vl(auVar183,auVar37,2);
                  bVar90 = bVar80 & (byte)uVar165;
                  if ((bVar80 & (byte)uVar165) != 0) {
                    auVar164._8_4_ = 0x7f800000;
                    auVar164._0_8_ = 0x7f8000007f800000;
                    auVar164._12_4_ = 0x7f800000;
                    auVar164._16_4_ = 0x7f800000;
                    auVar164._20_4_ = 0x7f800000;
                    auVar164._24_4_ = 0x7f800000;
                    auVar164._28_4_ = 0x7f800000;
                    auVar126 = vblendmps_avx512vl(auVar164,auVar183);
                    auVar140._0_4_ =
                         (uint)(bVar90 & 1) * auVar126._0_4_ |
                         (uint)!(bool)(bVar90 & 1) * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 1 & 1);
                    auVar140._4_4_ = (uint)bVar13 * auVar126._4_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 2 & 1);
                    auVar140._8_4_ = (uint)bVar13 * auVar126._8_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 3 & 1);
                    auVar140._12_4_ = (uint)bVar13 * auVar126._12_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 4 & 1);
                    auVar140._16_4_ = (uint)bVar13 * auVar126._16_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 5 & 1);
                    auVar140._20_4_ = (uint)bVar13 * auVar126._20_4_ | (uint)!bVar13 * 0x7f800000;
                    bVar13 = (bool)(bVar90 >> 6 & 1);
                    auVar140._24_4_ = (uint)bVar13 * auVar126._24_4_ | (uint)!bVar13 * 0x7f800000;
                    auVar140._28_4_ =
                         (uint)(bVar90 >> 7) * auVar126._28_4_ |
                         (uint)!(bool)(bVar90 >> 7) * 0x7f800000;
                    auVar126 = vshufps_avx(auVar140,auVar140,0xb1);
                    auVar126 = vminps_avx(auVar140,auVar126);
                    auVar118 = vshufpd_avx(auVar126,auVar126,5);
                    auVar126 = vminps_avx(auVar126,auVar118);
                    auVar118 = vpermpd_avx2(auVar126,0x4e);
                    auVar126 = vminps_avx(auVar126,auVar118);
                    uVar165 = vcmpps_avx512vl(auVar140,auVar126,0);
                    bVar79 = (byte)uVar165 & bVar90;
                    bVar80 = bVar90;
                    if (bVar79 != 0) {
                      bVar80 = bVar79;
                    }
                    uVar83 = 0;
                    for (uVar82 = (uint)bVar80; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000
                        ) {
                      uVar83 = uVar83 + 1;
                    }
                    uVar81 = (ulong)uVar83;
                  }
                } while (bVar90 != 0);
              }
            }
          }
        }
      }
      if (8 < iVar10) {
        local_540 = vpbroadcastd_avx512vl();
        local_580 = vbroadcastss_avx512vl(auVar94);
        fStack_4d0 = 1.0 / local_4e0;
        auStack_4dc._0_4_ = fStack_4d0;
        local_4e0 = fStack_4d0;
        auStack_4dc._4_4_ = fStack_4d0;
        fStack_4d4 = fStack_4d0;
        local_380 = vpbroadcastd_avx512vl();
        local_3a0 = vpbroadcastd_avx512vl();
        lVar88 = 8;
        auVar183 = auVar211._0_32_;
        auVar126 = auVar185._0_32_;
        local_500 = uVar85;
        uStack_4fc = uVar85;
        uStack_4f8 = uVar85;
        uStack_4f4 = uVar85;
        uStack_4f0 = uVar85;
        uStack_4ec = uVar85;
        uStack_4e8 = uVar85;
        uStack_4e4 = uVar85;
        fStack_4cc = fStack_4d0;
        fStack_4c8 = fStack_4d0;
        fStack_4c4 = fStack_4d0;
        do {
          auVar117 = vpbroadcastd_avx512vl();
          auVar101 = vpor_avx2(auVar117,_DAT_0205a920);
          uVar26 = vpcmpd_avx512vl(auVar101,local_540,1);
          auVar117 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar27);
          auVar118 = *(undefined1 (*) [32])(lVar27 + 0x2227768 + lVar88 * 4);
          auVar116 = *(undefined1 (*) [32])(lVar27 + 0x2227bec + lVar88 * 4);
          auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2228070 + lVar88 * 4);
          local_640 = auVar230._0_32_;
          auVar102 = vmulps_avx512vl(local_640,auVar115);
          local_660 = auVar231._0_32_;
          auVar103 = vmulps_avx512vl(local_660,auVar115);
          auVar42._4_4_ = auVar115._4_4_ * (float)local_120._4_4_;
          auVar42._0_4_ = auVar115._0_4_ * (float)local_120._0_4_;
          auVar42._8_4_ = auVar115._8_4_ * fStack_118;
          auVar42._12_4_ = auVar115._12_4_ * fStack_114;
          auVar42._16_4_ = auVar115._16_4_ * fStack_110;
          auVar42._20_4_ = auVar115._20_4_ * fStack_10c;
          auVar42._24_4_ = auVar115._24_4_ * fStack_108;
          auVar42._28_4_ = auVar101._28_4_;
          auVar101 = vfmadd231ps_avx512vl(auVar102,auVar116,local_c0);
          auVar102 = vfmadd231ps_avx512vl(auVar103,auVar116,local_e0);
          auVar103 = vfmadd231ps_avx512vl(auVar42,auVar116,local_100);
          auVar113 = auVar225._0_32_;
          auVar101 = vfmadd231ps_avx512vl(auVar101,auVar118,auVar113);
          auVar102 = vfmadd231ps_avx512vl(auVar102,auVar118,local_2e0);
          auVar94 = vfmadd231ps_fma(auVar103,auVar118,local_a0);
          auVar120 = auVar227._0_32_;
          auVar106 = vfmadd231ps_avx512vl(auVar101,auVar117,auVar120);
          auVar119 = auVar226._0_32_;
          auVar107 = vfmadd231ps_avx512vl(auVar102,auVar117,auVar119);
          auVar101 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar27);
          auVar102 = *(undefined1 (*) [32])(lVar27 + 0x2229b88 + lVar88 * 4);
          auVar94 = vfmadd231ps_fma(ZEXT1632(auVar94),auVar117,local_80);
          auVar103 = *(undefined1 (*) [32])(lVar27 + 0x222a00c + lVar88 * 4);
          auVar114 = *(undefined1 (*) [32])(lVar27 + 0x222a490 + lVar88 * 4);
          auVar104 = vmulps_avx512vl(local_640,auVar114);
          auVar105 = vmulps_avx512vl(local_660,auVar114);
          auVar43._4_4_ = auVar114._4_4_ * (float)local_120._4_4_;
          auVar43._0_4_ = auVar114._0_4_ * (float)local_120._0_4_;
          auVar43._8_4_ = auVar114._8_4_ * fStack_118;
          auVar43._12_4_ = auVar114._12_4_ * fStack_114;
          auVar43._16_4_ = auVar114._16_4_ * fStack_110;
          auVar43._20_4_ = auVar114._20_4_ * fStack_10c;
          auVar43._24_4_ = auVar114._24_4_ * fStack_108;
          auVar43._28_4_ = uStack_104;
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar103,local_c0);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar103,local_e0);
          auVar108 = vfmadd231ps_avx512vl(auVar43,auVar103,local_100);
          auVar104 = vfmadd231ps_avx512vl(auVar104,auVar102,auVar113);
          auVar105 = vfmadd231ps_avx512vl(auVar105,auVar102,local_2e0);
          auVar98 = vfmadd231ps_fma(auVar108,auVar102,local_a0);
          auVar108 = vfmadd231ps_avx512vl(auVar104,auVar101,auVar120);
          auVar109 = vfmadd231ps_avx512vl(auVar105,auVar101,auVar119);
          auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar101,local_80);
          auVar110 = vmaxps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar98));
          auVar104 = vsubps_avx(auVar108,auVar106);
          auVar105 = vsubps_avx(auVar109,auVar107);
          auVar111 = vmulps_avx512vl(auVar107,auVar104);
          auVar112 = vmulps_avx512vl(auVar106,auVar105);
          auVar111 = vsubps_avx512vl(auVar111,auVar112);
          auVar112 = vmulps_avx512vl(auVar105,auVar105);
          auVar112 = vfmadd231ps_avx512vl(auVar112,auVar104,auVar104);
          auVar110 = vmulps_avx512vl(auVar110,auVar110);
          auVar110 = vmulps_avx512vl(auVar110,auVar112);
          auVar111 = vmulps_avx512vl(auVar111,auVar111);
          uVar165 = vcmpps_avx512vl(auVar111,auVar110,2);
          local_410 = (byte)uVar26 & (byte)uVar165;
          if (local_410 == 0) {
            auVar226 = ZEXT3264(auVar119);
            auVar225 = ZEXT3264(auVar113);
          }
          else {
            auVar114 = vmulps_avx512vl(local_1a0,auVar114);
            auVar103 = vfmadd213ps_avx512vl(auVar103,local_180,auVar114);
            auVar102 = vfmadd213ps_avx512vl(auVar102,local_160,auVar103);
            auVar101 = vfmadd213ps_avx512vl(auVar101,local_140,auVar102);
            auVar115 = vmulps_avx512vl(local_1a0,auVar115);
            auVar116 = vfmadd213ps_avx512vl(auVar116,local_180,auVar115);
            auVar118 = vfmadd213ps_avx512vl(auVar118,local_160,auVar116);
            auVar102 = vfmadd213ps_avx512vl(auVar117,local_140,auVar118);
            auVar117 = *(undefined1 (*) [32])(lVar27 + 0x22284f4 + lVar88 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar27 + 0x2228978 + lVar88 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar27 + 0x2228dfc + lVar88 * 4);
            auVar115 = *(undefined1 (*) [32])(lVar27 + 0x2229280 + lVar88 * 4);
            auVar103 = vmulps_avx512vl(local_640,auVar115);
            auVar114 = vmulps_avx512vl(local_660,auVar115);
            auVar115 = vmulps_avx512vl(local_1a0,auVar115);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar116,local_c0);
            auVar114 = vfmadd231ps_avx512vl(auVar114,auVar116,local_e0);
            auVar116 = vfmadd231ps_avx512vl(auVar115,local_180,auVar116);
            auVar115 = vfmadd231ps_avx512vl(auVar103,auVar118,auVar113);
            auVar103 = vfmadd231ps_avx512vl(auVar114,auVar118,local_2e0);
            auVar118 = vfmadd231ps_avx512vl(auVar116,local_160,auVar118);
            auVar115 = vfmadd231ps_avx512vl(auVar115,auVar117,auVar120);
            auVar103 = vfmadd231ps_avx512vl(auVar103,auVar117,auVar119);
            auVar114 = vfmadd231ps_avx512vl(auVar118,local_140,auVar117);
            auVar117 = *(undefined1 (*) [32])(lVar27 + 0x222a914 + lVar88 * 4);
            auVar118 = *(undefined1 (*) [32])(lVar27 + 0x222b21c + lVar88 * 4);
            auVar116 = *(undefined1 (*) [32])(lVar27 + 0x222b6a0 + lVar88 * 4);
            auVar110 = vmulps_avx512vl(local_640,auVar116);
            auVar111 = vmulps_avx512vl(local_660,auVar116);
            auVar116 = vmulps_avx512vl(local_1a0,auVar116);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar118,local_c0);
            auVar111 = vfmadd231ps_avx512vl(auVar111,auVar118,local_e0);
            auVar116 = vfmadd231ps_avx512vl(auVar116,local_180,auVar118);
            auVar118 = *(undefined1 (*) [32])(lVar27 + 0x222ad98 + lVar88 * 4);
            auVar110 = vfmadd231ps_avx512vl(auVar110,auVar118,auVar113);
            auVar228 = vfmadd231ps_fma(auVar111,auVar118,local_2e0);
            auVar118 = vfmadd231ps_avx512vl(auVar116,local_160,auVar118);
            auVar116 = vfmadd231ps_avx512vl(auVar110,auVar117,auVar120);
            auVar110 = vfmadd231ps_avx512vl(ZEXT1632(auVar228),auVar117,auVar119);
            auVar118 = vfmadd231ps_avx512vl(auVar118,local_140,auVar117);
            auVar111 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
            vandps_avx512vl(auVar115,auVar111);
            vandps_avx512vl(auVar103,auVar111);
            auVar117 = vmaxps_avx(auVar111,auVar111);
            vandps_avx512vl(auVar114,auVar111);
            auVar117 = vmaxps_avx(auVar117,auVar111);
            uVar81 = vcmpps_avx512vl(auVar117,local_580,1);
            bVar13 = (bool)((byte)uVar81 & 1);
            auVar128._0_4_ = (float)((uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar115._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar128._4_4_ = (float)((uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar115._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar128._8_4_ = (float)((uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar115._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar128._12_4_ =
                 (float)((uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar115._12_4_);
            bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar128._16_4_ =
                 (float)((uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar115._16_4_);
            bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar128._20_4_ =
                 (float)((uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar115._20_4_);
            bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar128._24_4_ =
                 (float)((uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar115._24_4_);
            bVar13 = SUB81(uVar81 >> 7,0);
            auVar128._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar115._28_4_;
            bVar13 = (bool)((byte)uVar81 & 1);
            auVar129._0_4_ = (float)((uint)bVar13 * auVar105._0_4_ | (uint)!bVar13 * auVar103._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar129._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar103._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar129._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar103._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar129._12_4_ =
                 (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar103._12_4_);
            bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar129._16_4_ =
                 (float)((uint)bVar13 * auVar105._16_4_ | (uint)!bVar13 * auVar103._16_4_);
            bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar129._20_4_ =
                 (float)((uint)bVar13 * auVar105._20_4_ | (uint)!bVar13 * auVar103._20_4_);
            bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar129._24_4_ =
                 (float)((uint)bVar13 * auVar105._24_4_ | (uint)!bVar13 * auVar103._24_4_);
            bVar13 = SUB81(uVar81 >> 7,0);
            auVar129._28_4_ = (uint)bVar13 * auVar105._28_4_ | (uint)!bVar13 * auVar103._28_4_;
            vandps_avx512vl(auVar116,auVar111);
            vandps_avx512vl(auVar110,auVar111);
            auVar117 = vmaxps_avx(auVar129,auVar129);
            vandps_avx512vl(auVar118,auVar111);
            auVar117 = vmaxps_avx(auVar117,auVar129);
            uVar81 = vcmpps_avx512vl(auVar117,local_580,1);
            bVar13 = (bool)((byte)uVar81 & 1);
            auVar130._0_4_ = (uint)bVar13 * auVar104._0_4_ | (uint)!bVar13 * auVar116._0_4_;
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar130._4_4_ = (uint)bVar13 * auVar104._4_4_ | (uint)!bVar13 * auVar116._4_4_;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar130._8_4_ = (uint)bVar13 * auVar104._8_4_ | (uint)!bVar13 * auVar116._8_4_;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar130._12_4_ = (uint)bVar13 * auVar104._12_4_ | (uint)!bVar13 * auVar116._12_4_;
            bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar130._16_4_ = (uint)bVar13 * auVar104._16_4_ | (uint)!bVar13 * auVar116._16_4_;
            bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar130._20_4_ = (uint)bVar13 * auVar104._20_4_ | (uint)!bVar13 * auVar116._20_4_;
            bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar130._24_4_ = (uint)bVar13 * auVar104._24_4_ | (uint)!bVar13 * auVar116._24_4_;
            bVar13 = SUB81(uVar81 >> 7,0);
            auVar130._28_4_ = (uint)bVar13 * auVar104._28_4_ | (uint)!bVar13 * auVar116._28_4_;
            bVar13 = (bool)((byte)uVar81 & 1);
            auVar131._0_4_ = (float)((uint)bVar13 * auVar105._0_4_ | (uint)!bVar13 * auVar110._0_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar131._4_4_ = (float)((uint)bVar13 * auVar105._4_4_ | (uint)!bVar13 * auVar110._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar131._8_4_ = (float)((uint)bVar13 * auVar105._8_4_ | (uint)!bVar13 * auVar110._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar131._12_4_ =
                 (float)((uint)bVar13 * auVar105._12_4_ | (uint)!bVar13 * auVar110._12_4_);
            bVar13 = (bool)((byte)(uVar81 >> 4) & 1);
            auVar131._16_4_ =
                 (float)((uint)bVar13 * auVar105._16_4_ | (uint)!bVar13 * auVar110._16_4_);
            bVar13 = (bool)((byte)(uVar81 >> 5) & 1);
            auVar131._20_4_ =
                 (float)((uint)bVar13 * auVar105._20_4_ | (uint)!bVar13 * auVar110._20_4_);
            bVar13 = (bool)((byte)(uVar81 >> 6) & 1);
            auVar131._24_4_ =
                 (float)((uint)bVar13 * auVar105._24_4_ | (uint)!bVar13 * auVar110._24_4_);
            bVar13 = SUB81(uVar81 >> 7,0);
            auVar131._28_4_ = (uint)bVar13 * auVar105._28_4_ | (uint)!bVar13 * auVar110._28_4_;
            auVar217._8_4_ = 0x80000000;
            auVar217._0_8_ = 0x8000000080000000;
            auVar217._12_4_ = 0x80000000;
            auVar217._16_4_ = 0x80000000;
            auVar217._20_4_ = 0x80000000;
            auVar217._24_4_ = 0x80000000;
            auVar217._28_4_ = 0x80000000;
            auVar117 = vxorps_avx512vl(auVar130,auVar217);
            auVar110 = auVar229._0_32_;
            auVar118 = vfmadd213ps_avx512vl(auVar128,auVar128,auVar110);
            auVar228 = vfmadd231ps_fma(auVar118,auVar129,auVar129);
            auVar118 = vrsqrt14ps_avx512vl(ZEXT1632(auVar228));
            auVar224._8_4_ = 0xbf000000;
            auVar224._0_8_ = 0xbf000000bf000000;
            auVar224._12_4_ = 0xbf000000;
            auVar224._16_4_ = 0xbf000000;
            auVar224._20_4_ = 0xbf000000;
            auVar224._24_4_ = 0xbf000000;
            auVar224._28_4_ = 0xbf000000;
            fVar187 = auVar118._0_4_;
            fVar196 = auVar118._4_4_;
            fVar197 = auVar118._8_4_;
            fVar198 = auVar118._12_4_;
            fVar174 = auVar118._16_4_;
            fVar186 = auVar118._20_4_;
            fVar91 = auVar118._24_4_;
            auVar44._4_4_ = fVar196 * fVar196 * fVar196 * auVar228._4_4_ * -0.5;
            auVar44._0_4_ = fVar187 * fVar187 * fVar187 * auVar228._0_4_ * -0.5;
            auVar44._8_4_ = fVar197 * fVar197 * fVar197 * auVar228._8_4_ * -0.5;
            auVar44._12_4_ = fVar198 * fVar198 * fVar198 * auVar228._12_4_ * -0.5;
            auVar44._16_4_ = fVar174 * fVar174 * fVar174 * -0.0;
            auVar44._20_4_ = fVar186 * fVar186 * fVar186 * -0.0;
            auVar44._24_4_ = fVar91 * fVar91 * fVar91 * -0.0;
            auVar44._28_4_ = auVar129._28_4_;
            auVar116 = vbroadcastss_avx512vl(ZEXT416(0x3fc00000));
            auVar118 = vfmadd231ps_avx512vl(auVar44,auVar116,auVar118);
            auVar45._4_4_ = auVar129._4_4_ * auVar118._4_4_;
            auVar45._0_4_ = auVar129._0_4_ * auVar118._0_4_;
            auVar45._8_4_ = auVar129._8_4_ * auVar118._8_4_;
            auVar45._12_4_ = auVar129._12_4_ * auVar118._12_4_;
            auVar45._16_4_ = auVar129._16_4_ * auVar118._16_4_;
            auVar45._20_4_ = auVar129._20_4_ * auVar118._20_4_;
            auVar45._24_4_ = auVar129._24_4_ * auVar118._24_4_;
            auVar45._28_4_ = 0;
            auVar46._4_4_ = auVar118._4_4_ * -auVar128._4_4_;
            auVar46._0_4_ = auVar118._0_4_ * -auVar128._0_4_;
            auVar46._8_4_ = auVar118._8_4_ * -auVar128._8_4_;
            auVar46._12_4_ = auVar118._12_4_ * -auVar128._12_4_;
            auVar46._16_4_ = auVar118._16_4_ * -auVar128._16_4_;
            auVar46._20_4_ = auVar118._20_4_ * -auVar128._20_4_;
            auVar46._24_4_ = auVar118._24_4_ * -auVar128._24_4_;
            auVar46._28_4_ = auVar129._28_4_;
            auVar115 = vmulps_avx512vl(auVar118,auVar110);
            auVar118 = vfmadd213ps_avx512vl(auVar130,auVar130,auVar110);
            auVar118 = vfmadd231ps_avx512vl(auVar118,auVar131,auVar131);
            auVar103 = vrsqrt14ps_avx512vl(auVar118);
            auVar118 = vmulps_avx512vl(auVar118,auVar224);
            fVar187 = auVar103._0_4_;
            fVar196 = auVar103._4_4_;
            fVar197 = auVar103._8_4_;
            fVar198 = auVar103._12_4_;
            fVar174 = auVar103._16_4_;
            fVar186 = auVar103._20_4_;
            fVar91 = auVar103._24_4_;
            auVar47._4_4_ = fVar196 * fVar196 * fVar196 * auVar118._4_4_;
            auVar47._0_4_ = fVar187 * fVar187 * fVar187 * auVar118._0_4_;
            auVar47._8_4_ = fVar197 * fVar197 * fVar197 * auVar118._8_4_;
            auVar47._12_4_ = fVar198 * fVar198 * fVar198 * auVar118._12_4_;
            auVar47._16_4_ = fVar174 * fVar174 * fVar174 * auVar118._16_4_;
            auVar47._20_4_ = fVar186 * fVar186 * fVar186 * auVar118._20_4_;
            auVar47._24_4_ = fVar91 * fVar91 * fVar91 * auVar118._24_4_;
            auVar47._28_4_ = auVar118._28_4_;
            auVar118 = vfmadd231ps_avx512vl(auVar47,auVar116,auVar103);
            auVar48._4_4_ = auVar131._4_4_ * auVar118._4_4_;
            auVar48._0_4_ = auVar131._0_4_ * auVar118._0_4_;
            auVar48._8_4_ = auVar131._8_4_ * auVar118._8_4_;
            auVar48._12_4_ = auVar131._12_4_ * auVar118._12_4_;
            auVar48._16_4_ = auVar131._16_4_ * auVar118._16_4_;
            auVar48._20_4_ = auVar131._20_4_ * auVar118._20_4_;
            auVar48._24_4_ = auVar131._24_4_ * auVar118._24_4_;
            auVar48._28_4_ = auVar103._28_4_;
            auVar49._4_4_ = auVar118._4_4_ * auVar117._4_4_;
            auVar49._0_4_ = auVar118._0_4_ * auVar117._0_4_;
            auVar49._8_4_ = auVar118._8_4_ * auVar117._8_4_;
            auVar49._12_4_ = auVar118._12_4_ * auVar117._12_4_;
            auVar49._16_4_ = auVar118._16_4_ * auVar117._16_4_;
            auVar49._20_4_ = auVar118._20_4_ * auVar117._20_4_;
            auVar49._24_4_ = auVar118._24_4_ * auVar117._24_4_;
            auVar49._28_4_ = auVar117._28_4_;
            auVar117 = vmulps_avx512vl(auVar118,auVar110);
            auVar228 = vfmadd213ps_fma(auVar45,ZEXT1632(auVar94),auVar106);
            auVar118 = ZEXT1632(auVar94);
            auVar22 = vfmadd213ps_fma(auVar46,auVar118,auVar107);
            auVar116 = vfmadd213ps_avx512vl(auVar115,auVar118,auVar102);
            auVar103 = vfmadd213ps_avx512vl(auVar48,ZEXT1632(auVar98),auVar108);
            auVar99 = vfnmadd213ps_fma(auVar45,auVar118,auVar106);
            auVar114 = ZEXT1632(auVar98);
            auVar97 = vfmadd213ps_fma(auVar49,auVar114,auVar109);
            auVar93 = vfnmadd213ps_fma(auVar46,auVar118,auVar107);
            auVar23 = vfmadd213ps_fma(auVar117,auVar114,auVar101);
            auVar107 = ZEXT1632(auVar94);
            auVar153 = vfnmadd231ps_fma(auVar102,auVar107,auVar115);
            auVar151 = vfnmadd213ps_fma(auVar48,auVar114,auVar108);
            auVar152 = vfnmadd213ps_fma(auVar49,auVar114,auVar109);
            auVar100 = vfnmadd231ps_fma(auVar101,ZEXT1632(auVar98),auVar117);
            auVar101 = vsubps_avx512vl(auVar103,ZEXT1632(auVar99));
            auVar117 = vsubps_avx(ZEXT1632(auVar97),ZEXT1632(auVar93));
            auVar118 = vsubps_avx(ZEXT1632(auVar23),ZEXT1632(auVar153));
            auVar50._4_4_ = auVar117._4_4_ * auVar153._4_4_;
            auVar50._0_4_ = auVar117._0_4_ * auVar153._0_4_;
            auVar50._8_4_ = auVar117._8_4_ * auVar153._8_4_;
            auVar50._12_4_ = auVar117._12_4_ * auVar153._12_4_;
            auVar50._16_4_ = auVar117._16_4_ * 0.0;
            auVar50._20_4_ = auVar117._20_4_ * 0.0;
            auVar50._24_4_ = auVar117._24_4_ * 0.0;
            auVar50._28_4_ = auVar115._28_4_;
            auVar94 = vfmsub231ps_fma(auVar50,ZEXT1632(auVar93),auVar118);
            auVar51._4_4_ = auVar118._4_4_ * auVar99._4_4_;
            auVar51._0_4_ = auVar118._0_4_ * auVar99._0_4_;
            auVar51._8_4_ = auVar118._8_4_ * auVar99._8_4_;
            auVar51._12_4_ = auVar118._12_4_ * auVar99._12_4_;
            auVar51._16_4_ = auVar118._16_4_ * 0.0;
            auVar51._20_4_ = auVar118._20_4_ * 0.0;
            auVar51._24_4_ = auVar118._24_4_ * 0.0;
            auVar51._28_4_ = auVar118._28_4_;
            auVar24 = vfmsub231ps_fma(auVar51,ZEXT1632(auVar153),auVar101);
            auVar52._4_4_ = auVar93._4_4_ * auVar101._4_4_;
            auVar52._0_4_ = auVar93._0_4_ * auVar101._0_4_;
            auVar52._8_4_ = auVar93._8_4_ * auVar101._8_4_;
            auVar52._12_4_ = auVar93._12_4_ * auVar101._12_4_;
            auVar52._16_4_ = auVar101._16_4_ * 0.0;
            auVar52._20_4_ = auVar101._20_4_ * 0.0;
            auVar52._24_4_ = auVar101._24_4_ * 0.0;
            auVar52._28_4_ = auVar101._28_4_;
            auVar95 = vfmsub231ps_fma(auVar52,ZEXT1632(auVar99),auVar117);
            auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar95),auVar110,ZEXT1632(auVar24));
            auVar117 = vfmadd231ps_avx512vl(auVar117,auVar110,ZEXT1632(auVar94));
            uVar81 = vcmpps_avx512vl(auVar117,auVar110,2);
            bVar90 = (byte)uVar81;
            fVar142 = (float)((uint)(bVar90 & 1) * auVar228._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * auVar151._0_4_);
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            fVar144 = (float)((uint)bVar13 * auVar228._4_4_ | (uint)!bVar13 * auVar151._4_4_);
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            fVar147 = (float)((uint)bVar13 * auVar228._8_4_ | (uint)!bVar13 * auVar151._8_4_);
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            fVar148 = (float)((uint)bVar13 * auVar228._12_4_ | (uint)!bVar13 * auVar151._12_4_);
            auVar114 = ZEXT1632(CONCAT412(fVar148,CONCAT48(fVar147,CONCAT44(fVar144,fVar142))));
            fVar143 = (float)((uint)(bVar90 & 1) * auVar22._0_4_ |
                             (uint)!(bool)(bVar90 & 1) * auVar152._0_4_);
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            fVar146 = (float)((uint)bVar13 * auVar22._4_4_ | (uint)!bVar13 * auVar152._4_4_);
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            fVar145 = (float)((uint)bVar13 * auVar22._8_4_ | (uint)!bVar13 * auVar152._8_4_);
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            fVar149 = (float)((uint)bVar13 * auVar22._12_4_ | (uint)!bVar13 * auVar152._12_4_);
            auVar104 = ZEXT1632(CONCAT412(fVar149,CONCAT48(fVar145,CONCAT44(fVar146,fVar143))));
            auVar132._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar116._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar100._0_4_);
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar132._4_4_ = (float)((uint)bVar13 * auVar116._4_4_ | (uint)!bVar13 * auVar100._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar132._8_4_ = (float)((uint)bVar13 * auVar116._8_4_ | (uint)!bVar13 * auVar100._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar132._12_4_ =
                 (float)((uint)bVar13 * auVar116._12_4_ | (uint)!bVar13 * auVar100._12_4_);
            fVar197 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar116._16_4_);
            auVar132._16_4_ = fVar197;
            fVar196 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar116._20_4_);
            auVar132._20_4_ = fVar196;
            fVar187 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar116._24_4_);
            auVar132._24_4_ = fVar187;
            iVar1 = (uint)(byte)(uVar81 >> 7) * auVar116._28_4_;
            auVar132._28_4_ = iVar1;
            auVar117 = vblendmps_avx512vl(ZEXT1632(auVar99),auVar103);
            auVar133._0_4_ =
                 (uint)(bVar90 & 1) * auVar117._0_4_ | (uint)!(bool)(bVar90 & 1) * auVar94._0_4_;
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar133._4_4_ = (uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar94._4_4_;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar133._8_4_ = (uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar94._8_4_;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar133._12_4_ = (uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar94._12_4_;
            auVar133._16_4_ = (uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_;
            auVar133._20_4_ = (uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_;
            auVar133._24_4_ = (uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_;
            auVar133._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
            auVar117 = vblendmps_avx512vl(ZEXT1632(auVar93),ZEXT1632(auVar97));
            auVar134._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar228._0_4_);
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar134._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar228._4_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar134._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar228._8_4_)
            ;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar134._12_4_ =
                 (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar228._12_4_);
            fVar174 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_);
            auVar134._16_4_ = fVar174;
            fVar186 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_);
            auVar134._20_4_ = fVar186;
            fVar198 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_);
            auVar134._24_4_ = fVar198;
            auVar134._28_4_ = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
            auVar117 = vblendmps_avx512vl(ZEXT1632(auVar153),ZEXT1632(auVar23));
            auVar135._0_4_ =
                 (float)((uint)(bVar90 & 1) * auVar117._0_4_ |
                        (uint)!(bool)(bVar90 & 1) * auVar22._0_4_);
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar135._4_4_ = (float)((uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * auVar22._4_4_);
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar135._8_4_ = (float)((uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * auVar22._8_4_);
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar135._12_4_ =
                 (float)((uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * auVar22._12_4_);
            fVar92 = (float)((uint)((byte)(uVar81 >> 4) & 1) * auVar117._16_4_);
            auVar135._16_4_ = fVar92;
            fVar141 = (float)((uint)((byte)(uVar81 >> 5) & 1) * auVar117._20_4_);
            auVar135._20_4_ = fVar141;
            fVar91 = (float)((uint)((byte)(uVar81 >> 6) & 1) * auVar117._24_4_);
            auVar135._24_4_ = fVar91;
            iVar2 = (uint)(byte)(uVar81 >> 7) * auVar117._28_4_;
            auVar135._28_4_ = iVar2;
            auVar136._0_4_ =
                 (uint)(bVar90 & 1) * (int)auVar99._0_4_ |
                 (uint)!(bool)(bVar90 & 1) * auVar103._0_4_;
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            auVar136._4_4_ = (uint)bVar13 * (int)auVar99._4_4_ | (uint)!bVar13 * auVar103._4_4_;
            bVar13 = (bool)((byte)(uVar81 >> 2) & 1);
            auVar136._8_4_ = (uint)bVar13 * (int)auVar99._8_4_ | (uint)!bVar13 * auVar103._8_4_;
            bVar13 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar136._12_4_ = (uint)bVar13 * (int)auVar99._12_4_ | (uint)!bVar13 * auVar103._12_4_;
            auVar136._16_4_ = (uint)!(bool)((byte)(uVar81 >> 4) & 1) * auVar103._16_4_;
            auVar136._20_4_ = (uint)!(bool)((byte)(uVar81 >> 5) & 1) * auVar103._20_4_;
            auVar136._24_4_ = (uint)!(bool)((byte)(uVar81 >> 6) & 1) * auVar103._24_4_;
            auVar136._28_4_ = (uint)!SUB81(uVar81 >> 7,0) * auVar103._28_4_;
            bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
            bVar15 = (bool)((byte)(uVar81 >> 2) & 1);
            bVar17 = (bool)((byte)(uVar81 >> 3) & 1);
            bVar14 = (bool)((byte)(uVar81 >> 1) & 1);
            bVar16 = (bool)((byte)(uVar81 >> 2) & 1);
            bVar18 = (bool)((byte)(uVar81 >> 3) & 1);
            auVar103 = vsubps_avx512vl(auVar136,auVar114);
            auVar118 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar17 * (int)auVar93._12_4_ |
                                                     (uint)!bVar17 * auVar97._12_4_,
                                                     CONCAT48((uint)bVar15 * (int)auVar93._8_4_ |
                                                              (uint)!bVar15 * auVar97._8_4_,
                                                              CONCAT44((uint)bVar13 *
                                                                       (int)auVar93._4_4_ |
                                                                       (uint)!bVar13 * auVar97._4_4_
                                                                       ,(uint)(bVar90 & 1) *
                                                                        (int)auVar93._0_4_ |
                                                                        (uint)!(bool)(bVar90 & 1) *
                                                                        auVar97._0_4_)))),auVar104);
            auVar116 = vsubps_avx(ZEXT1632(CONCAT412((uint)bVar18 * (int)auVar153._12_4_ |
                                                     (uint)!bVar18 * auVar23._12_4_,
                                                     CONCAT48((uint)bVar16 * (int)auVar153._8_4_ |
                                                              (uint)!bVar16 * auVar23._8_4_,
                                                              CONCAT44((uint)bVar14 *
                                                                       (int)auVar153._4_4_ |
                                                                       (uint)!bVar14 * auVar23._4_4_
                                                                       ,(uint)(bVar90 & 1) *
                                                                        (int)auVar153._0_4_ |
                                                                        (uint)!(bool)(bVar90 & 1) *
                                                                        auVar23._0_4_)))),auVar132);
            auVar115 = vsubps_avx(auVar114,auVar133);
            auVar101 = vsubps_avx(auVar104,auVar134);
            auVar102 = vsubps_avx(auVar132,auVar135);
            auVar53._4_4_ = auVar116._4_4_ * fVar144;
            auVar53._0_4_ = auVar116._0_4_ * fVar142;
            auVar53._8_4_ = auVar116._8_4_ * fVar147;
            auVar53._12_4_ = auVar116._12_4_ * fVar148;
            auVar53._16_4_ = auVar116._16_4_ * 0.0;
            auVar53._20_4_ = auVar116._20_4_ * 0.0;
            auVar53._24_4_ = auVar116._24_4_ * 0.0;
            auVar53._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar53,auVar132,auVar103);
            auVar184._0_4_ = fVar143 * auVar103._0_4_;
            auVar184._4_4_ = fVar146 * auVar103._4_4_;
            auVar184._8_4_ = fVar145 * auVar103._8_4_;
            auVar184._12_4_ = fVar149 * auVar103._12_4_;
            auVar184._16_4_ = auVar103._16_4_ * 0.0;
            auVar184._20_4_ = auVar103._20_4_ * 0.0;
            auVar184._24_4_ = auVar103._24_4_ * 0.0;
            auVar184._28_4_ = 0;
            auVar228 = vfmsub231ps_fma(auVar184,auVar114,auVar118);
            auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar228),auVar110,ZEXT1632(auVar94));
            auVar192._0_4_ = auVar118._0_4_ * auVar132._0_4_;
            auVar192._4_4_ = auVar118._4_4_ * auVar132._4_4_;
            auVar192._8_4_ = auVar118._8_4_ * auVar132._8_4_;
            auVar192._12_4_ = auVar118._12_4_ * auVar132._12_4_;
            auVar192._16_4_ = auVar118._16_4_ * fVar197;
            auVar192._20_4_ = auVar118._20_4_ * fVar196;
            auVar192._24_4_ = auVar118._24_4_ * fVar187;
            auVar192._28_4_ = 0;
            auVar94 = vfmsub231ps_fma(auVar192,auVar104,auVar116);
            auVar105 = vfmadd231ps_avx512vl(auVar117,auVar110,ZEXT1632(auVar94));
            auVar117 = vmulps_avx512vl(auVar102,auVar133);
            auVar117 = vfmsub231ps_avx512vl(auVar117,auVar115,auVar135);
            auVar54._4_4_ = auVar101._4_4_ * auVar135._4_4_;
            auVar54._0_4_ = auVar101._0_4_ * auVar135._0_4_;
            auVar54._8_4_ = auVar101._8_4_ * auVar135._8_4_;
            auVar54._12_4_ = auVar101._12_4_ * auVar135._12_4_;
            auVar54._16_4_ = auVar101._16_4_ * fVar92;
            auVar54._20_4_ = auVar101._20_4_ * fVar141;
            auVar54._24_4_ = auVar101._24_4_ * fVar91;
            auVar54._28_4_ = iVar2;
            auVar94 = vfmsub231ps_fma(auVar54,auVar134,auVar102);
            auVar193._0_4_ = auVar134._0_4_ * auVar115._0_4_;
            auVar193._4_4_ = auVar134._4_4_ * auVar115._4_4_;
            auVar193._8_4_ = auVar134._8_4_ * auVar115._8_4_;
            auVar193._12_4_ = auVar134._12_4_ * auVar115._12_4_;
            auVar193._16_4_ = fVar174 * auVar115._16_4_;
            auVar193._20_4_ = fVar186 * auVar115._20_4_;
            auVar193._24_4_ = fVar198 * auVar115._24_4_;
            auVar193._28_4_ = 0;
            auVar228 = vfmsub231ps_fma(auVar193,auVar101,auVar133);
            auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar228),auVar110,auVar117);
            auVar106 = vfmadd231ps_avx512vl(auVar117,auVar110,ZEXT1632(auVar94));
            auVar117 = vmaxps_avx(auVar105,auVar106);
            uVar165 = vcmpps_avx512vl(auVar117,auVar110,2);
            local_410 = local_410 & (byte)uVar165;
            if (local_410 == 0) {
LAB_01b9e745:
              local_410 = 0;
            }
            else {
              auVar55._4_4_ = auVar102._4_4_ * auVar118._4_4_;
              auVar55._0_4_ = auVar102._0_4_ * auVar118._0_4_;
              auVar55._8_4_ = auVar102._8_4_ * auVar118._8_4_;
              auVar55._12_4_ = auVar102._12_4_ * auVar118._12_4_;
              auVar55._16_4_ = auVar102._16_4_ * auVar118._16_4_;
              auVar55._20_4_ = auVar102._20_4_ * auVar118._20_4_;
              auVar55._24_4_ = auVar102._24_4_ * auVar118._24_4_;
              auVar55._28_4_ = auVar117._28_4_;
              auVar22 = vfmsub231ps_fma(auVar55,auVar101,auVar116);
              auVar56._4_4_ = auVar116._4_4_ * auVar115._4_4_;
              auVar56._0_4_ = auVar116._0_4_ * auVar115._0_4_;
              auVar56._8_4_ = auVar116._8_4_ * auVar115._8_4_;
              auVar56._12_4_ = auVar116._12_4_ * auVar115._12_4_;
              auVar56._16_4_ = auVar116._16_4_ * auVar115._16_4_;
              auVar56._20_4_ = auVar116._20_4_ * auVar115._20_4_;
              auVar56._24_4_ = auVar116._24_4_ * auVar115._24_4_;
              auVar56._28_4_ = auVar116._28_4_;
              auVar228 = vfmsub231ps_fma(auVar56,auVar103,auVar102);
              auVar57._4_4_ = auVar101._4_4_ * auVar103._4_4_;
              auVar57._0_4_ = auVar101._0_4_ * auVar103._0_4_;
              auVar57._8_4_ = auVar101._8_4_ * auVar103._8_4_;
              auVar57._12_4_ = auVar101._12_4_ * auVar103._12_4_;
              auVar57._16_4_ = auVar101._16_4_ * auVar103._16_4_;
              auVar57._20_4_ = auVar101._20_4_ * auVar103._20_4_;
              auVar57._24_4_ = auVar101._24_4_ * auVar103._24_4_;
              auVar57._28_4_ = auVar101._28_4_;
              auVar97 = vfmsub231ps_fma(auVar57,auVar115,auVar118);
              auVar94 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar228),ZEXT1632(auVar97));
              auVar117 = vfmadd231ps_avx512vl(ZEXT1632(auVar94),ZEXT1632(auVar22),auVar110);
              auVar118 = vrcp14ps_avx512vl(auVar117);
              auVar32._8_4_ = 0x3f800000;
              auVar32._0_8_ = &DAT_3f8000003f800000;
              auVar32._12_4_ = 0x3f800000;
              auVar32._16_4_ = 0x3f800000;
              auVar32._20_4_ = 0x3f800000;
              auVar32._24_4_ = 0x3f800000;
              auVar32._28_4_ = 0x3f800000;
              auVar116 = vfnmadd213ps_avx512vl(auVar118,auVar117,auVar32);
              auVar94 = vfmadd132ps_fma(auVar116,auVar118,auVar118);
              auVar58._4_4_ = auVar97._4_4_ * auVar132._4_4_;
              auVar58._0_4_ = auVar97._0_4_ * auVar132._0_4_;
              auVar58._8_4_ = auVar97._8_4_ * auVar132._8_4_;
              auVar58._12_4_ = auVar97._12_4_ * auVar132._12_4_;
              auVar58._16_4_ = fVar197 * 0.0;
              auVar58._20_4_ = fVar196 * 0.0;
              auVar58._24_4_ = fVar187 * 0.0;
              auVar58._28_4_ = iVar1;
              auVar228 = vfmadd231ps_fma(auVar58,auVar104,ZEXT1632(auVar228));
              auVar228 = vfmadd231ps_fma(ZEXT1632(auVar228),auVar114,ZEXT1632(auVar22));
              fVar187 = auVar94._0_4_;
              fVar196 = auVar94._4_4_;
              fVar197 = auVar94._8_4_;
              fVar198 = auVar94._12_4_;
              auVar118 = ZEXT1632(CONCAT412(auVar228._12_4_ * fVar198,
                                            CONCAT48(auVar228._8_4_ * fVar197,
                                                     CONCAT44(auVar228._4_4_ * fVar196,
                                                              auVar228._0_4_ * fVar187))));
              auVar78._4_4_ = uStack_4fc;
              auVar78._0_4_ = local_500;
              auVar78._8_4_ = uStack_4f8;
              auVar78._12_4_ = uStack_4f4;
              auVar78._16_4_ = uStack_4f0;
              auVar78._20_4_ = uStack_4ec;
              auVar78._24_4_ = uStack_4e8;
              auVar78._28_4_ = uStack_4e4;
              uVar165 = vcmpps_avx512vl(auVar118,auVar78,0xd);
              uVar150 = *(undefined4 *)(ray + k * 4 + 0x100);
              auVar33._4_4_ = uVar150;
              auVar33._0_4_ = uVar150;
              auVar33._8_4_ = uVar150;
              auVar33._12_4_ = uVar150;
              auVar33._16_4_ = uVar150;
              auVar33._20_4_ = uVar150;
              auVar33._24_4_ = uVar150;
              auVar33._28_4_ = uVar150;
              uVar26 = vcmpps_avx512vl(auVar118,auVar33,2);
              local_410 = (byte)uVar165 & (byte)uVar26 & local_410;
              if (local_410 == 0) goto LAB_01b9e745;
              uVar165 = vcmpps_avx512vl(auVar117,auVar110,4);
              if ((local_410 & (byte)uVar165) == 0) {
                local_410 = 0;
              }
              else {
                local_410 = local_410 & (byte)uVar165;
                fVar174 = auVar105._0_4_ * fVar187;
                fVar186 = auVar105._4_4_ * fVar196;
                auVar59._4_4_ = fVar186;
                auVar59._0_4_ = fVar174;
                fVar91 = auVar105._8_4_ * fVar197;
                auVar59._8_4_ = fVar91;
                fVar92 = auVar105._12_4_ * fVar198;
                auVar59._12_4_ = fVar92;
                fVar141 = auVar105._16_4_ * 0.0;
                auVar59._16_4_ = fVar141;
                fVar142 = auVar105._20_4_ * 0.0;
                auVar59._20_4_ = fVar142;
                fVar143 = auVar105._24_4_ * 0.0;
                auVar59._24_4_ = fVar143;
                auVar59._28_4_ = auVar105._28_4_;
                fVar187 = auVar106._0_4_ * fVar187;
                fVar196 = auVar106._4_4_ * fVar196;
                auVar60._4_4_ = fVar196;
                auVar60._0_4_ = fVar187;
                fVar197 = auVar106._8_4_ * fVar197;
                auVar60._8_4_ = fVar197;
                fVar198 = auVar106._12_4_ * fVar198;
                auVar60._12_4_ = fVar198;
                fVar144 = auVar106._16_4_ * 0.0;
                auVar60._16_4_ = fVar144;
                fVar146 = auVar106._20_4_ * 0.0;
                auVar60._20_4_ = fVar146;
                fVar147 = auVar106._24_4_ * 0.0;
                auVar60._24_4_ = fVar147;
                auVar60._28_4_ = auVar106._28_4_;
                auVar205._8_4_ = 0x3f800000;
                auVar205._0_8_ = &DAT_3f8000003f800000;
                auVar205._12_4_ = 0x3f800000;
                auVar205._16_4_ = 0x3f800000;
                auVar205._20_4_ = 0x3f800000;
                auVar205._24_4_ = 0x3f800000;
                auVar205._28_4_ = 0x3f800000;
                auVar117 = vsubps_avx512vl(auVar205,auVar59);
                bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar81 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
                bVar19 = SUB81(uVar81 >> 7,0);
                in_ZMM20 = ZEXT3264(CONCAT428((uint)bVar19 * auVar105._28_4_ |
                                              (uint)!bVar19 * auVar117._28_4_,
                                              CONCAT424((uint)bVar18 * (int)fVar143 |
                                                        (uint)!bVar18 * auVar117._24_4_,
                                                        CONCAT420((uint)bVar17 * (int)fVar142 |
                                                                  (uint)!bVar17 * auVar117._20_4_,
                                                                  CONCAT416((uint)bVar16 *
                                                                            (int)fVar141 |
                                                                            (uint)!bVar16 *
                                                                            auVar117._16_4_,
                                                                            CONCAT412((uint)bVar15 *
                                                                                      (int)fVar92 |
                                                                                      (uint)!bVar15
                                                                                      * auVar117.
                                                  _12_4_,CONCAT48((uint)bVar14 * (int)fVar91 |
                                                                  (uint)!bVar14 * auVar117._8_4_,
                                                                  CONCAT44((uint)bVar13 *
                                                                           (int)fVar186 |
                                                                           (uint)!bVar13 *
                                                                           auVar117._4_4_,
                                                                           (uint)(bVar90 & 1) *
                                                                           (int)fVar174 |
                                                                           (uint)!(bool)(bVar90 & 1)
                                                                           * auVar117._0_4_))))))));
                auVar117 = vsubps_avx(auVar205,auVar60);
                bVar13 = (bool)((byte)(uVar81 >> 1) & 1);
                bVar14 = (bool)((byte)(uVar81 >> 2) & 1);
                bVar15 = (bool)((byte)(uVar81 >> 3) & 1);
                bVar16 = (bool)((byte)(uVar81 >> 4) & 1);
                bVar17 = (bool)((byte)(uVar81 >> 5) & 1);
                bVar18 = (bool)((byte)(uVar81 >> 6) & 1);
                bVar19 = SUB81(uVar81 >> 7,0);
                local_360._4_4_ = (uint)bVar13 * (int)fVar196 | (uint)!bVar13 * auVar117._4_4_;
                local_360._0_4_ =
                     (uint)(bVar90 & 1) * (int)fVar187 | (uint)!(bool)(bVar90 & 1) * auVar117._0_4_;
                local_360._8_4_ = (uint)bVar14 * (int)fVar197 | (uint)!bVar14 * auVar117._8_4_;
                local_360._12_4_ = (uint)bVar15 * (int)fVar198 | (uint)!bVar15 * auVar117._12_4_;
                local_360._16_4_ = (uint)bVar16 * (int)fVar144 | (uint)!bVar16 * auVar117._16_4_;
                local_360._20_4_ = (uint)bVar17 * (int)fVar146 | (uint)!bVar17 * auVar117._20_4_;
                local_360._24_4_ = (uint)bVar18 * (int)fVar147 | (uint)!bVar18 * auVar117._24_4_;
                local_360._28_4_ = (uint)bVar19 * auVar106._28_4_ | (uint)!bVar19 * auVar117._28_4_;
                in_ZMM21 = ZEXT3264(auVar118);
              }
            }
            auVar226 = ZEXT3264(local_680);
            auVar225 = ZEXT3264(local_6a0);
            if (local_410 != 0) {
              auVar117 = vsubps_avx(ZEXT1632(auVar98),auVar107);
              local_600 = in_ZMM20._0_32_;
              auVar117 = vfmadd213ps_avx512vl(auVar117,local_600,auVar107);
              auVar160._0_4_ = auVar117._0_4_ + auVar117._0_4_;
              auVar160._4_4_ = auVar117._4_4_ + auVar117._4_4_;
              auVar160._8_4_ = auVar117._8_4_ + auVar117._8_4_;
              auVar160._12_4_ = auVar117._12_4_ + auVar117._12_4_;
              auVar160._16_4_ = auVar117._16_4_ + auVar117._16_4_;
              auVar160._20_4_ = auVar117._20_4_ + auVar117._20_4_;
              auVar160._24_4_ = auVar117._24_4_ + auVar117._24_4_;
              auVar160._28_4_ = auVar117._28_4_ + auVar117._28_4_;
              uVar150 = *(undefined4 *)((long)pre->ray_space + k * 4 + -0x20);
              auVar34._4_4_ = uVar150;
              auVar34._0_4_ = uVar150;
              auVar34._8_4_ = uVar150;
              auVar34._12_4_ = uVar150;
              auVar34._16_4_ = uVar150;
              auVar34._20_4_ = uVar150;
              auVar34._24_4_ = uVar150;
              auVar34._28_4_ = uVar150;
              auVar117 = vmulps_avx512vl(auVar160,auVar34);
              local_620 = in_ZMM21._0_32_;
              uVar165 = vcmpps_avx512vl(local_620,auVar117,6);
              local_410 = local_410 & (byte)uVar165;
              uVar85 = (uint)local_410;
              if (local_410 != 0) {
                auVar161._8_4_ = 0xbf800000;
                auVar161._0_8_ = 0xbf800000bf800000;
                auVar161._12_4_ = 0xbf800000;
                auVar161._16_4_ = 0xbf800000;
                auVar161._20_4_ = 0xbf800000;
                auVar161._24_4_ = 0xbf800000;
                auVar161._28_4_ = 0xbf800000;
                auVar35._8_4_ = 0x40000000;
                auVar35._0_8_ = 0x4000000040000000;
                auVar35._12_4_ = 0x40000000;
                auVar35._16_4_ = 0x40000000;
                auVar35._20_4_ = 0x40000000;
                auVar35._24_4_ = 0x40000000;
                auVar35._28_4_ = 0x40000000;
                local_4a0 = vfmadd132ps_avx512vl(local_360,auVar161,auVar35);
                local_360 = local_4a0;
                auVar117 = local_360;
                local_460 = (undefined4)lVar88;
                local_420 = CONCAT44(fStack_6bc,local_6c0);
                uStack_418 = CONCAT44(fStack_6b4,fStack_6b8);
                pGVar86 = (context->scene->geometries).items[uVar87].ptr;
                local_360 = auVar117;
                if ((pGVar86->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                  auVar117 = vaddps_avx512vl(local_600,_DAT_02020f40);
                  auVar94 = vcvtsi2ss_avx512f(local_c0._0_16_,local_460);
                  fVar187 = auVar94._0_4_;
                  local_400[0] = (fVar187 + auVar117._0_4_) * local_4e0;
                  local_400[1] = (fVar187 + auVar117._4_4_) * (float)auStack_4dc._0_4_;
                  local_400[2] = (fVar187 + auVar117._8_4_) * (float)auStack_4dc._4_4_;
                  local_400[3] = (fVar187 + auVar117._12_4_) * fStack_4d4;
                  fStack_3f0 = (fVar187 + auVar117._16_4_) * fStack_4d0;
                  fStack_3ec = (fVar187 + auVar117._20_4_) * fStack_4cc;
                  fStack_3e8 = (fVar187 + auVar117._24_4_) * fStack_4c8;
                  fStack_3e4 = fVar187 + auVar117._28_4_;
                  local_360._0_8_ = local_4a0._0_8_;
                  local_360._8_8_ = local_4a0._8_8_;
                  local_360._16_8_ = local_4a0._16_8_;
                  local_360._24_8_ = local_4a0._24_8_;
                  local_3e0 = local_360._0_8_;
                  uStack_3d8 = local_360._8_8_;
                  uStack_3d0 = local_360._16_8_;
                  uStack_3c8 = local_360._24_8_;
                  local_3c0 = local_620;
                  auVar162._8_4_ = 0x7f800000;
                  auVar162._0_8_ = 0x7f8000007f800000;
                  auVar162._12_4_ = 0x7f800000;
                  auVar162._16_4_ = 0x7f800000;
                  auVar162._20_4_ = 0x7f800000;
                  auVar162._24_4_ = 0x7f800000;
                  auVar162._28_4_ = 0x7f800000;
                  auVar117 = vblendmps_avx512vl(auVar162,local_620);
                  auVar137._0_4_ =
                       (uint)(local_410 & 1) * auVar117._0_4_ |
                       (uint)!(bool)(local_410 & 1) * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 1 & 1);
                  auVar137._4_4_ = (uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 2 & 1);
                  auVar137._8_4_ = (uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 3 & 1);
                  auVar137._12_4_ = (uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 4 & 1);
                  auVar137._16_4_ = (uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 5 & 1);
                  auVar137._20_4_ = (uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * 0x7f800000;
                  bVar13 = (bool)(local_410 >> 6 & 1);
                  auVar137._24_4_ = (uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * 0x7f800000;
                  auVar137._28_4_ =
                       (uint)(local_410 >> 7) * auVar117._28_4_ |
                       (uint)!(bool)(local_410 >> 7) * 0x7f800000;
                  auVar117 = vshufps_avx(auVar137,auVar137,0xb1);
                  auVar117 = vminps_avx(auVar137,auVar117);
                  auVar118 = vshufpd_avx(auVar117,auVar117,5);
                  auVar117 = vminps_avx(auVar117,auVar118);
                  auVar118 = vpermpd_avx2(auVar117,0x4e);
                  auVar117 = vminps_avx(auVar117,auVar118);
                  uVar165 = vcmpps_avx512vl(auVar137,auVar117,0);
                  bVar80 = (byte)uVar165 & local_410;
                  bVar90 = local_410;
                  if (bVar80 != 0) {
                    bVar90 = bVar80;
                  }
                  uVar83 = 0;
                  for (uVar82 = (uint)bVar90; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x80000000)
                  {
                    uVar83 = uVar83 + 1;
                  }
                  uVar81 = (ulong)uVar83;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar86->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar187 = local_400[uVar81];
                    uVar150 = *(undefined4 *)((long)&local_3e0 + uVar81 * 4);
                    fVar197 = 1.0 - fVar187;
                    fVar196 = fVar197 * fVar197 * -3.0;
                    auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar197 * fVar197)),
                                              ZEXT416((uint)(fVar187 * fVar197)),ZEXT416(0xc0000000)
                                             );
                    auVar98 = vfmsub132ss_fma(ZEXT416((uint)(fVar187 * fVar197)),
                                              ZEXT416((uint)(fVar187 * fVar187)),ZEXT416(0x40000000)
                                             );
                    fVar197 = auVar94._0_4_ * 3.0;
                    fVar198 = auVar98._0_4_ * 3.0;
                    fVar174 = fVar187 * fVar187 * 3.0;
                    auVar201._0_4_ = fVar174 * local_6c0;
                    auVar201._4_4_ = fVar174 * fStack_6bc;
                    auVar201._8_4_ = fVar174 * fStack_6b8;
                    auVar201._12_4_ = fVar174 * fStack_6b4;
                    auVar172._4_4_ = fVar198;
                    auVar172._0_4_ = fVar198;
                    auVar172._8_4_ = fVar198;
                    auVar172._12_4_ = fVar198;
                    auVar94 = vfmadd132ps_fma(auVar172,auVar201,auVar20);
                    auVar180._4_4_ = fVar197;
                    auVar180._0_4_ = fVar197;
                    auVar180._8_4_ = fVar197;
                    auVar180._12_4_ = fVar197;
                    auVar94 = vfmadd132ps_fma(auVar180,auVar94,auVar21);
                    auVar173._4_4_ = fVar196;
                    auVar173._0_4_ = fVar196;
                    auVar173._8_4_ = fVar196;
                    auVar173._12_4_ = fVar196;
                    auVar94 = vfmadd213ps_fma(auVar173,auVar96,auVar94);
                    *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar81 * 4);
                    *(int *)(ray + k * 4 + 0x180) = auVar94._0_4_;
                    uVar11 = vextractps_avx(auVar94,1);
                    *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar11;
                    uVar11 = vextractps_avx(auVar94,2);
                    *(undefined4 *)(ray + k * 4 + 0x1c0) = uVar11;
                    *(float *)(ray + k * 4 + 0x1e0) = fVar187;
                    *(undefined4 *)(ray + k * 4 + 0x200) = uVar150;
                    *(uint *)(ray + k * 4 + 0x220) = uVar9;
                    *(uint *)(ray + k * 4 + 0x240) = uVar87;
                    *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
                  }
                  else {
                    local_5c0 = (float)uVar67;
                    fStack_5bc = (float)((ulong)uVar67 >> 0x20);
                    fStack_5b8 = (float)uVar68;
                    fStack_5b4 = (float)((ulong)uVar68 >> 0x20);
                    local_320 = local_420;
                    uStack_318 = uStack_418;
                    local_6b0 = pGVar86;
                    local_5b0 = uVar25;
                    uStack_5a8 = uVar66;
                    local_4c0 = local_600;
                    local_480 = local_620;
                    local_45c = iVar10;
                    local_450 = auVar96;
                    local_440 = uVar25;
                    uStack_438 = uVar66;
                    local_430 = uVar67;
                    uStack_428 = uVar68;
                    do {
                      auVar228 = auVar229._0_16_;
                      local_5a0 = *(undefined4 *)(ray + k * 4 + 0x100);
                      local_260 = local_400[uVar81];
                      local_240 = *(undefined4 *)((long)&local_3e0 + uVar81 * 4);
                      *(undefined4 *)(ray + k * 4 + 0x100) = *(undefined4 *)(local_3c0 + uVar81 * 4)
                      ;
                      local_6f0.context = context->user;
                      fVar196 = 1.0 - local_260;
                      fVar187 = fVar196 * fVar196 * -3.0;
                      auVar94 = vfmadd231ss_fma(ZEXT416((uint)(fVar196 * fVar196)),
                                                ZEXT416((uint)(local_260 * fVar196)),
                                                ZEXT416(0xc0000000));
                      auVar98 = vfmsub132ss_fma(ZEXT416((uint)(local_260 * fVar196)),
                                                ZEXT416((uint)(local_260 * local_260)),
                                                ZEXT416(0x40000000));
                      fVar196 = auVar94._0_4_ * 3.0;
                      fVar197 = auVar98._0_4_ * 3.0;
                      fVar198 = local_260 * local_260 * 3.0;
                      auVar202._0_4_ = fVar198 * (float)local_320;
                      auVar202._4_4_ = fVar198 * local_320._4_4_;
                      auVar202._8_4_ = fVar198 * (float)uStack_318;
                      auVar202._12_4_ = fVar198 * uStack_318._4_4_;
                      auVar154._4_4_ = fVar197;
                      auVar154._0_4_ = fVar197;
                      auVar154._8_4_ = fVar197;
                      auVar154._12_4_ = fVar197;
                      auVar74._4_4_ = fStack_5bc;
                      auVar74._0_4_ = local_5c0;
                      auVar74._8_4_ = fStack_5b8;
                      auVar74._12_4_ = fStack_5b4;
                      auVar94 = vfmadd132ps_fma(auVar154,auVar202,auVar74);
                      auVar181._4_4_ = fVar196;
                      auVar181._0_4_ = fVar196;
                      auVar181._8_4_ = fVar196;
                      auVar181._12_4_ = fVar196;
                      auVar75._8_8_ = uStack_5a8;
                      auVar75._0_8_ = local_5b0;
                      auVar94 = vfmadd132ps_fma(auVar181,auVar94,auVar75);
                      auVar155._4_4_ = fVar187;
                      auVar155._0_4_ = fVar187;
                      auVar155._8_4_ = fVar187;
                      auVar155._12_4_ = fVar187;
                      auVar94 = vfmadd213ps_fma(auVar155,auVar96,auVar94);
                      local_2c0 = auVar94._0_4_;
                      auVar194._8_4_ = 1;
                      auVar194._0_8_ = 0x100000001;
                      auVar194._12_4_ = 1;
                      auVar194._16_4_ = 1;
                      auVar194._20_4_ = 1;
                      auVar194._24_4_ = 1;
                      auVar194._28_4_ = 1;
                      local_2a0 = vpermps_avx2(auVar194,ZEXT1632(auVar94));
                      auVar206._8_4_ = 2;
                      auVar206._0_8_ = 0x200000002;
                      auVar206._12_4_ = 2;
                      auVar206._16_4_ = 2;
                      auVar206._20_4_ = 2;
                      auVar206._24_4_ = 2;
                      auVar206._28_4_ = 2;
                      local_280 = vpermps_avx2(auVar206,ZEXT1632(auVar94));
                      iStack_2bc = local_2c0;
                      iStack_2b8 = local_2c0;
                      iStack_2b4 = local_2c0;
                      iStack_2b0 = local_2c0;
                      iStack_2ac = local_2c0;
                      iStack_2a8 = local_2c0;
                      iStack_2a4 = local_2c0;
                      fStack_25c = local_260;
                      fStack_258 = local_260;
                      fStack_254 = local_260;
                      fStack_250 = local_260;
                      fStack_24c = local_260;
                      fStack_248 = local_260;
                      fStack_244 = local_260;
                      uStack_23c = local_240;
                      uStack_238 = local_240;
                      uStack_234 = local_240;
                      uStack_230 = local_240;
                      uStack_22c = local_240;
                      uStack_228 = local_240;
                      uStack_224 = local_240;
                      local_220 = local_3a0._0_8_;
                      uStack_218 = local_3a0._8_8_;
                      uStack_210 = local_3a0._16_8_;
                      uStack_208 = local_3a0._24_8_;
                      local_200 = local_380;
                      auVar117 = vpcmpeqd_avx2(local_380,local_380);
                      local_6a8[1] = auVar117;
                      *local_6a8 = auVar117;
                      local_1e0 = (local_6f0.context)->instID[0];
                      uStack_1dc = local_1e0;
                      uStack_1d8 = local_1e0;
                      uStack_1d4 = local_1e0;
                      uStack_1d0 = local_1e0;
                      uStack_1cc = local_1e0;
                      uStack_1c8 = local_1e0;
                      uStack_1c4 = local_1e0;
                      local_1c0 = (local_6f0.context)->instPrimID[0];
                      uStack_1bc = local_1c0;
                      uStack_1b8 = local_1c0;
                      uStack_1b4 = local_1c0;
                      uStack_1b0 = local_1c0;
                      uStack_1ac = local_1c0;
                      uStack_1a8 = local_1c0;
                      uStack_1a4 = local_1c0;
                      local_5e0 = local_300._0_8_;
                      uStack_5d8 = local_300._8_8_;
                      uStack_5d0 = local_300._16_8_;
                      uStack_5c8 = local_300._24_8_;
                      local_6f0.valid = (int *)&local_5e0;
                      local_6f0.geometryUserPtr = pGVar86->userPtr;
                      local_6f0.hit = (RTCHitN *)&local_2c0;
                      local_6f0.N = 8;
                      local_520._0_4_ = uVar85;
                      local_6f0.ray = (RTCRayN *)ray;
                      if (pGVar86->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                        (*pGVar86->intersectionFilterN)(&local_6f0);
                        auVar231 = ZEXT3264(local_660);
                        auVar230 = ZEXT3264(local_640);
                        auVar225 = ZEXT3264(local_6a0);
                        auVar226 = ZEXT3264(local_680);
                        auVar227 = ZEXT3264(local_560);
                        in_ZMM21 = ZEXT3264(local_620);
                        in_ZMM20 = ZEXT3264(local_600);
                        auVar94 = vxorps_avx512vl(auVar228,auVar228);
                        auVar229 = ZEXT1664(auVar94);
                        pGVar86 = local_6b0;
                        uVar85 = local_520._0_4_;
                      }
                      bVar90 = (byte)uVar85;
                      auVar94 = auVar229._0_16_;
                      auVar70._8_8_ = uStack_5d8;
                      auVar70._0_8_ = local_5e0;
                      auVar70._16_8_ = uStack_5d0;
                      auVar70._24_8_ = uStack_5c8;
                      if (auVar70 == (undefined1  [32])0x0) {
LAB_01b9eba3:
                        *(undefined4 *)(ray + k * 4 + 0x100) = local_5a0;
                      }
                      else {
                        p_Var12 = context->args->filter;
                        if ((p_Var12 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar86->field_8).field_0x2 & 0x40) != 0)))) {
                          (*p_Var12)(&local_6f0);
                          bVar90 = local_520[0];
                          auVar231 = ZEXT3264(local_660);
                          auVar230 = ZEXT3264(local_640);
                          auVar225 = ZEXT3264(local_6a0);
                          auVar226 = ZEXT3264(local_680);
                          auVar227 = ZEXT3264(local_560);
                          in_ZMM21 = ZEXT3264(local_620);
                          in_ZMM20 = ZEXT3264(local_600);
                          auVar94 = vxorps_avx512vl(auVar94,auVar94);
                          auVar229 = ZEXT1664(auVar94);
                          pGVar86 = local_6b0;
                        }
                        auVar71._8_8_ = uStack_5d8;
                        auVar71._0_8_ = local_5e0;
                        auVar71._16_8_ = uStack_5d0;
                        auVar71._24_8_ = uStack_5c8;
                        if (auVar71 == (undefined1  [32])0x0) goto LAB_01b9eba3;
                        uVar84 = vptestmd_avx512vl(auVar71,auVar71);
                        iVar1 = *(int *)(local_6f0.hit + 4);
                        iVar2 = *(int *)(local_6f0.hit + 8);
                        iVar61 = *(int *)(local_6f0.hit + 0xc);
                        iVar62 = *(int *)(local_6f0.hit + 0x10);
                        iVar63 = *(int *)(local_6f0.hit + 0x14);
                        iVar64 = *(int *)(local_6f0.hit + 0x18);
                        iVar65 = *(int *)(local_6f0.hit + 0x1c);
                        bVar80 = (byte)uVar84;
                        bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                        bVar19 = SUB81(uVar84 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x180) =
                             (uint)(bVar80 & 1) * *(int *)local_6f0.hit |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x180);
                        *(uint *)(local_6f0.ray + 0x184) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x184);
                        *(uint *)(local_6f0.ray + 0x188) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x188);
                        *(uint *)(local_6f0.ray + 0x18c) =
                             (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x18c)
                        ;
                        *(uint *)(local_6f0.ray + 400) =
                             (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 400);
                        *(uint *)(local_6f0.ray + 0x194) =
                             (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x194)
                        ;
                        *(uint *)(local_6f0.ray + 0x198) =
                             (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x198)
                        ;
                        *(uint *)(local_6f0.ray + 0x19c) =
                             (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x19c)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 0x24);
                        iVar2 = *(int *)(local_6f0.hit + 0x28);
                        iVar61 = *(int *)(local_6f0.hit + 0x2c);
                        iVar62 = *(int *)(local_6f0.hit + 0x30);
                        iVar63 = *(int *)(local_6f0.hit + 0x34);
                        iVar64 = *(int *)(local_6f0.hit + 0x38);
                        iVar65 = *(int *)(local_6f0.hit + 0x3c);
                        bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                        bVar19 = SUB81(uVar84 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x1a0) =
                             (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x20) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x1a0);
                        *(uint *)(local_6f0.ray + 0x1a4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1a4);
                        *(uint *)(local_6f0.ray + 0x1a8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1a8);
                        *(uint *)(local_6f0.ray + 0x1ac) =
                             (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ac)
                        ;
                        *(uint *)(local_6f0.ray + 0x1b0) =
                             (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1b0)
                        ;
                        *(uint *)(local_6f0.ray + 0x1b4) =
                             (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1b4)
                        ;
                        *(uint *)(local_6f0.ray + 0x1b8) =
                             (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1b8)
                        ;
                        *(uint *)(local_6f0.ray + 0x1bc) =
                             (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1bc)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 0x44);
                        iVar2 = *(int *)(local_6f0.hit + 0x48);
                        iVar61 = *(int *)(local_6f0.hit + 0x4c);
                        iVar62 = *(int *)(local_6f0.hit + 0x50);
                        iVar63 = *(int *)(local_6f0.hit + 0x54);
                        iVar64 = *(int *)(local_6f0.hit + 0x58);
                        iVar65 = *(int *)(local_6f0.hit + 0x5c);
                        bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                        bVar19 = SUB81(uVar84 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x1c0) =
                             (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x40) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x1c0);
                        *(uint *)(local_6f0.ray + 0x1c4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1c4);
                        *(uint *)(local_6f0.ray + 0x1c8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1c8);
                        *(uint *)(local_6f0.ray + 0x1cc) =
                             (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1cc)
                        ;
                        *(uint *)(local_6f0.ray + 0x1d0) =
                             (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1d0)
                        ;
                        *(uint *)(local_6f0.ray + 0x1d4) =
                             (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x1d4)
                        ;
                        *(uint *)(local_6f0.ray + 0x1d8) =
                             (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1d8)
                        ;
                        *(uint *)(local_6f0.ray + 0x1dc) =
                             (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1dc)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 100);
                        iVar2 = *(int *)(local_6f0.hit + 0x68);
                        iVar61 = *(int *)(local_6f0.hit + 0x6c);
                        iVar62 = *(int *)(local_6f0.hit + 0x70);
                        iVar63 = *(int *)(local_6f0.hit + 0x74);
                        iVar64 = *(int *)(local_6f0.hit + 0x78);
                        iVar65 = *(int *)(local_6f0.hit + 0x7c);
                        bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                        bVar19 = SUB81(uVar84 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x1e0) =
                             (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x60) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x1e0);
                        *(uint *)(local_6f0.ray + 0x1e4) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x1e4);
                        *(uint *)(local_6f0.ray + 0x1e8) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x1e8);
                        *(uint *)(local_6f0.ray + 0x1ec) =
                             (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x1ec)
                        ;
                        *(uint *)(local_6f0.ray + 0x1f0) =
                             (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x1f0)
                        ;
                        *(uint *)(local_6f0.ray + 500) =
                             (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 500);
                        *(uint *)(local_6f0.ray + 0x1f8) =
                             (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x1f8)
                        ;
                        *(uint *)(local_6f0.ray + 0x1fc) =
                             (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x1fc)
                        ;
                        iVar1 = *(int *)(local_6f0.hit + 0x84);
                        iVar2 = *(int *)(local_6f0.hit + 0x88);
                        iVar61 = *(int *)(local_6f0.hit + 0x8c);
                        iVar62 = *(int *)(local_6f0.hit + 0x90);
                        iVar63 = *(int *)(local_6f0.hit + 0x94);
                        iVar64 = *(int *)(local_6f0.hit + 0x98);
                        iVar65 = *(int *)(local_6f0.hit + 0x9c);
                        bVar13 = (bool)((byte)(uVar84 >> 1) & 1);
                        bVar14 = (bool)((byte)(uVar84 >> 2) & 1);
                        bVar15 = (bool)((byte)(uVar84 >> 3) & 1);
                        bVar16 = (bool)((byte)(uVar84 >> 4) & 1);
                        bVar17 = (bool)((byte)(uVar84 >> 5) & 1);
                        bVar18 = (bool)((byte)(uVar84 >> 6) & 1);
                        bVar19 = SUB81(uVar84 >> 7,0);
                        *(uint *)(local_6f0.ray + 0x200) =
                             (uint)(bVar80 & 1) * *(int *)(local_6f0.hit + 0x80) |
                             (uint)!(bool)(bVar80 & 1) * *(int *)(local_6f0.ray + 0x200);
                        *(uint *)(local_6f0.ray + 0x204) =
                             (uint)bVar13 * iVar1 | (uint)!bVar13 * *(int *)(local_6f0.ray + 0x204);
                        *(uint *)(local_6f0.ray + 0x208) =
                             (uint)bVar14 * iVar2 | (uint)!bVar14 * *(int *)(local_6f0.ray + 0x208);
                        *(uint *)(local_6f0.ray + 0x20c) =
                             (uint)bVar15 * iVar61 | (uint)!bVar15 * *(int *)(local_6f0.ray + 0x20c)
                        ;
                        *(uint *)(local_6f0.ray + 0x210) =
                             (uint)bVar16 * iVar62 | (uint)!bVar16 * *(int *)(local_6f0.ray + 0x210)
                        ;
                        *(uint *)(local_6f0.ray + 0x214) =
                             (uint)bVar17 * iVar63 | (uint)!bVar17 * *(int *)(local_6f0.ray + 0x214)
                        ;
                        *(uint *)(local_6f0.ray + 0x218) =
                             (uint)bVar18 * iVar64 | (uint)!bVar18 * *(int *)(local_6f0.ray + 0x218)
                        ;
                        *(uint *)(local_6f0.ray + 0x21c) =
                             (uint)bVar19 * iVar65 | (uint)!bVar19 * *(int *)(local_6f0.ray + 0x21c)
                        ;
                        auVar117 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xa0));
                        *(undefined1 (*) [32])(local_6f0.ray + 0x220) = auVar117;
                        auVar117 = vmovdqu32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xc0));
                        *(undefined1 (*) [32])(local_6f0.ray + 0x240) = auVar117;
                        auVar117 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0xe0));
                        *(undefined1 (*) [32])(local_6f0.ray + 0x260) = auVar117;
                        auVar117 = vmovdqa32_avx512vl(*(undefined1 (*) [32])(local_6f0.hit + 0x100))
                        ;
                        *(undefined1 (*) [32])(local_6f0.ray + 0x280) = auVar117;
                      }
                      bVar90 = ~(byte)(1 << ((uint)uVar81 & 0x1f)) & bVar90;
                      uVar150 = *(undefined4 *)(ray + k * 4 + 0x100);
                      auVar36._4_4_ = uVar150;
                      auVar36._0_4_ = uVar150;
                      auVar36._8_4_ = uVar150;
                      auVar36._12_4_ = uVar150;
                      auVar36._16_4_ = uVar150;
                      auVar36._20_4_ = uVar150;
                      auVar36._24_4_ = uVar150;
                      auVar36._28_4_ = uVar150;
                      uVar165 = vcmpps_avx512vl(in_ZMM21._0_32_,auVar36,2);
                      bVar80 = bVar90 & (byte)uVar165;
                      uVar85 = (uint)bVar80;
                      if ((bVar90 & (byte)uVar165) != 0) {
                        auVar163._8_4_ = 0x7f800000;
                        auVar163._0_8_ = 0x7f8000007f800000;
                        auVar163._12_4_ = 0x7f800000;
                        auVar163._16_4_ = 0x7f800000;
                        auVar163._20_4_ = 0x7f800000;
                        auVar163._24_4_ = 0x7f800000;
                        auVar163._28_4_ = 0x7f800000;
                        auVar117 = vblendmps_avx512vl(auVar163,in_ZMM21._0_32_);
                        auVar138._0_4_ =
                             (uint)(bVar80 & 1) * auVar117._0_4_ |
                             (uint)!(bool)(bVar80 & 1) * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 1 & 1);
                        auVar138._4_4_ = (uint)bVar13 * auVar117._4_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 2 & 1);
                        auVar138._8_4_ = (uint)bVar13 * auVar117._8_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 3 & 1);
                        auVar138._12_4_ =
                             (uint)bVar13 * auVar117._12_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 4 & 1);
                        auVar138._16_4_ =
                             (uint)bVar13 * auVar117._16_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 5 & 1);
                        auVar138._20_4_ =
                             (uint)bVar13 * auVar117._20_4_ | (uint)!bVar13 * 0x7f800000;
                        bVar13 = (bool)(bVar80 >> 6 & 1);
                        auVar138._24_4_ =
                             (uint)bVar13 * auVar117._24_4_ | (uint)!bVar13 * 0x7f800000;
                        auVar138._28_4_ =
                             (uint)(bVar80 >> 7) * auVar117._28_4_ |
                             (uint)!(bool)(bVar80 >> 7) * 0x7f800000;
                        auVar117 = vshufps_avx(auVar138,auVar138,0xb1);
                        auVar117 = vminps_avx(auVar138,auVar117);
                        auVar118 = vshufpd_avx(auVar117,auVar117,5);
                        auVar117 = vminps_avx(auVar117,auVar118);
                        auVar118 = vpermpd_avx2(auVar117,0x4e);
                        auVar117 = vminps_avx(auVar117,auVar118);
                        uVar165 = vcmpps_avx512vl(auVar138,auVar117,0);
                        bVar90 = (byte)uVar165 & bVar80;
                        uVar83 = uVar85;
                        if (bVar90 != 0) {
                          uVar83 = (uint)bVar90;
                        }
                        uVar82 = 0;
                        for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x80000000) {
                          uVar82 = uVar82 + 1;
                        }
                        uVar81 = (ulong)uVar82;
                      }
                    } while (bVar80 != 0);
                  }
                }
              }
            }
          }
          auVar211 = ZEXT3264(auVar183);
          auVar185 = ZEXT3264(auVar126);
          lVar88 = lVar88 + 8;
        } while ((int)lVar88 < iVar10);
      }
      uVar150 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar28._4_4_ = uVar150;
      auVar28._0_4_ = uVar150;
      auVar28._8_4_ = uVar150;
      auVar28._12_4_ = uVar150;
      uVar25 = vcmpps_avx512vl(local_310,auVar28,2);
      uVar87 = (uint)uVar89 & (uint)uVar25;
      uVar89 = (ulong)uVar87;
    } while (uVar87 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_t(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }